

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_seek_test(void)

{
  uint64_t *__s;
  fdb_seqnum_t *__s_00;
  bottom_up_build_ctx *__s_01;
  fdb_commit_opt_t opt;
  fdb_file_handle *pfVar1;
  avl_node *__n;
  btree *pbVar2;
  size_t *psVar3;
  size_t keylen;
  filemgr *keylen_00;
  fdb_config *pfVar4;
  long lVar5;
  undefined1 *puVar6;
  fdb_status fVar7;
  int iVar8;
  fdb_iterator *pfVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *pfVar17;
  char *fconfig_00;
  atomic<unsigned_char> *fconfig_01;
  fdb_doc *pfVar18;
  list *doc;
  btreeblk_handle *pbVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  char *pcVar45;
  ulong uVar46;
  char *pcVar47;
  fdb_iterator *pfVar48;
  char *pcVar49;
  hbtrie *doc_00;
  fdb_doc *unaff_R12;
  long lVar50;
  fdb_doc *pfVar51;
  char *unaff_R13;
  ulong uVar52;
  void *pvVar53;
  bool bVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  uint8_t auStackY_11b99 [1805];
  fdb_commit_opt_t afStackY_1148c [4132];
  fdb_kvs_handle afStack_10458 [125];
  undefined8 uStack_4f0;
  undefined1 auStack_4d8 [8];
  undefined1 local_4d0 [8];
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  undefined1 local_d0 [8];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  void *local_a0;
  fdb_doc *local_98 [6];
  fdb_doc *local_68;
  fdb_doc *local_60;
  fdb_kvs_handle *local_58;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  
  pcVar45 = &stack0xfffffffffffffff8;
  puVar20 = auStack_4d8;
  puVar21 = auStack_4d8;
  puVar22 = auStack_4d8;
  puVar23 = auStack_4d8;
  puVar24 = auStack_4d8;
  puVar25 = auStack_4d8;
  puVar26 = auStack_4d8;
  puVar27 = auStack_4d8;
  puVar28 = auStack_4d8;
  puVar29 = auStack_4d8;
  puVar30 = auStack_4d8;
  puVar31 = auStack_4d8;
  puVar32 = auStack_4d8;
  puVar33 = auStack_4d8;
  puVar34 = auStack_4d8;
  puVar35 = auStack_4d8;
  puVar36 = auStack_4d8;
  puVar37 = auStack_4d8;
  puVar38 = auStack_4d8;
  puVar39 = auStack_4d8;
  puVar40 = auStack_4d8;
  puVar41 = auStack_4d8;
  puVar42 = auStack_4d8;
  puVar43 = auStack_4d8;
  puVar44 = auStack_4d8;
  pfVar17 = (fdb_kvs_handle *)auStack_4d8;
  pfVar16 = (fdb_kvs_handle *)auStack_4d8;
  gettimeofday((timeval *)local_d0,(__timezone_ptr_t)0x0);
  memleak_start();
  iterator = (fdb_iterator *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  pfVar9 = (fdb_iterator *)&__test_begin.tv_usec;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.wal_threshold._4_4_ = 1;
  pcVar47 = (char *)&kv1;
  fdb_open((fdb_file_handle **)pcVar47,"./iterator_test1",(fdb_config *)local_4d0);
  pfVar15 = (fdb_kvs_handle *)&dbfile;
  fdb_kvs_open_default((fdb_file_handle *)kv1,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)pfVar9);
  fVar7 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"iterator_seek_test");
  pfVar14 = (fdb_kvs_handle *)auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011317e;
  fVar7 = fdb_kvs_open((fdb_file_handle *)kv1,&local_58,"kv1",
                       (fdb_kvs_config *)&__test_begin.tv_usec);
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113183;
  pfVar14 = (fdb_kvs_handle *)0x0;
  pcVar47 = (char *)0x0;
  do {
    sprintf(bodybuf + 0xf8,"kEy%d",(ulong)pcVar47 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"mEta%d",(ulong)pcVar47 & 0xffffffff);
    sprintf(metabuf + 0xf8,"bOdy%d",(ulong)pcVar47 & 0xffffffff);
    unaff_R13 = (char *)((long)&kvs_config.custom_cmp_param + (long)pfVar14);
    pfVar9 = (fdb_iterator *)strlen(bodybuf + 0xf8);
    unaff_R12 = (fdb_doc *)strlen((char *)&fconfig.num_blocks_readahead);
    sVar10 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x11240a;
    fdb_doc_create((fdb_doc **)unaff_R13,bodybuf + 0xf8,(size_t)pfVar9,&fconfig.num_blocks_readahead
                   ,(size_t)unaff_R12,metabuf + 0xf8,sVar10);
    fVar7 = fdb_set(local_58,(fdb_doc *)(&kvs_config.custom_cmp_param)[(long)pcVar47]);
    if (fVar7 != FDB_RESULT_SUCCESS) {
      iterator_seek_test();
      goto LAB_0011312d;
    }
    fdb_doc_free((fdb_doc *)(&kvs_config.custom_cmp_param)[(long)pcVar47]);
    pcVar47 = &(((fdb_kvs_handle *)pcVar47)->kvs_config).field_0x1;
    pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).custom_cmp;
  } while (pcVar47 != (undefined1 *)0xa);
  lVar50 = 8;
  uVar46 = 1;
  do {
    sprintf(bodybuf + 0xf8,"key%d",uVar46 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",uVar46 & 0xffffffff);
    sprintf(metabuf + 0xf8,"body%d",uVar46 & 0xffffffff);
    sVar10 = strlen(bodybuf + 0xf8);
    sVar11 = strlen((char *)&fconfig.num_blocks_readahead);
    sVar12 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x1124f4;
    fdb_doc_create((fdb_doc **)((long)&kvs_config.custom_cmp_param + lVar50),bodybuf + 0xf8,sVar10,
                   &fconfig.num_blocks_readahead,sVar11,metabuf + 0xf8,sVar12);
    fdb_set((fdb_kvs_handle *)dbfile,(fdb_doc *)(&kvs_config.custom_cmp_param)[uVar46]);
    lVar50 = lVar50 + 0x10;
    bVar54 = uVar46 < 8;
    uVar46 = uVar46 + 2;
  } while (bVar54);
  fdb_commit((fdb_file_handle *)kv1,'\x01');
  lVar50 = 0;
  uVar46 = 0;
  do {
    sprintf(bodybuf + 0xf8,"key%d",uVar46 & 0xffffffff);
    sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",uVar46 & 0xffffffff);
    sprintf(metabuf + 0xf8,"body%d",uVar46 & 0xffffffff);
    unaff_R13 = (char *)((long)&kvs_config.custom_cmp_param + lVar50);
    pfVar9 = (fdb_iterator *)strlen(bodybuf + 0xf8);
    unaff_R12 = (fdb_doc *)strlen((char *)&fconfig.num_blocks_readahead);
    sVar10 = strlen(metabuf + 0xf8);
    uStack_4f0 = 0x1125d4;
    fdb_doc_create((fdb_doc **)unaff_R13,bodybuf + 0xf8,(size_t)pfVar9,&fconfig.num_blocks_readahead
                   ,(size_t)unaff_R12,metabuf + 0xf8,sVar10);
    fdb_set((fdb_kvs_handle *)dbfile,(fdb_doc *)(&kvs_config.custom_cmp_param)[uVar46]);
    pcVar47 = (char *)(uVar46 + 2);
    lVar50 = lVar50 + 0x10;
    bVar54 = uVar46 < 8;
    uVar46 = (ulong)pcVar47;
  } while (bVar54);
  fdb_commit((fdb_file_handle *)kv1,'\0');
  uStack_4f0 = 0x112629;
  fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,0,0);
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar14 = (fdb_kvs_handle *)iterator;
  pfVar18 = (fdb_doc *)kvs_config.custom_cmp_param;
  pfVar15 = (fdb_kvs_handle *)&db;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113188;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = *(char **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_0011318d;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_start;
  pcVar47 = *(char **)((long)pfVar18 + 0x38);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_00113198;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_prev;
  pcVar47 = *(char **)((long)pfVar18 + 0x40);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->seqtree_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001131a3;
  fdb_doc_free((fdb_doc *)pfVar14);
  pfVar14 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar9 = (fdb_iterator *)local_98[0]->key;
  sVar10 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar14,pfVar9,sVar10,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001131ae;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar15 = (fdb_kvs_handle *)iterator;
  pfVar51 = local_98[0];
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001131b3;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_98[0]->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  if (iVar8 != 0) goto LAB_001131b8;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_start;
  pcVar47 = (char *)pfVar51->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->hbtrie_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001131c3;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_prev;
  pcVar47 = (char *)pfVar51->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->seqtree_iterator);
  if (iVar8 != 0) goto LAB_001131ce;
  fdb_doc_free((fdb_doc *)pfVar15);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_next((fdb_iterator *)db);
  puVar6 = auStack_4d8;
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001131d9;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar14 = (fdb_kvs_handle *)iterator;
  pfVar18 = local_98[1];
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001131de;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_98[1]->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001131e3;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_start;
  pcVar47 = (char *)pfVar18->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_001131ee;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_prev;
  pcVar47 = (char *)pfVar18->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->seqtree_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001131f9;
  fdb_doc_free((fdb_doc *)pfVar14);
  pfVar14 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar9 = (fdb_iterator *)local_60->key;
  sVar10 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar14,pfVar9,sVar10,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113204;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar15 = (fdb_kvs_handle *)iterator;
  pfVar51 = local_60;
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113209;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_60->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  if (iVar8 != 0) goto LAB_0011320e;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_start;
  pcVar47 = (char *)pfVar51->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->hbtrie_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_00113219;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_prev;
  pcVar47 = (char *)pfVar51->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->seqtree_iterator);
  if (iVar8 != 0) goto LAB_00113224;
  fdb_doc_free((fdb_doc *)pfVar15);
  pfVar15 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar9 = *(fdb_iterator **)((long)kvs_config.custom_cmp_param + 0x20);
  sVar10 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar9,sVar10,'\0');
  puVar6 = auStack_4d8;
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011322f;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar14 = (fdb_kvs_handle *)iterator;
  unaff_R12 = (fdb_doc *)kvs_config.custom_cmp_param;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113234;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = *(char **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_00113239;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_start;
  pcVar47 = *(char **)((long)unaff_R12 + 0x38);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_00113244;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_prev;
  pcVar47 = *(char **)((long)unaff_R12 + 0x40);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->seqtree_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_0011324f;
  fdb_doc_free((fdb_doc *)pfVar14);
  pfVar14 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar9 = (fdb_iterator *)local_98[0]->key;
  sVar10 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar14,pfVar9,sVar10,'\0');
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011325a;
  unaff_R13 = (char *)0x2;
  pfVar48 = pfVar9;
  do {
    fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
    pfVar9 = iterator;
    pfVar15 = pfVar14;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113138;
    pcVar47 = (char *)iterator->_seqnum;
    pfVar14 = (fdb_kvs_handle *)(&kvs_config.custom_cmp_param)[(long)unaff_R13];
    unaff_R12 = (fdb_doc *)pfVar14->op_stats;
    iVar8 = bcmp(pcVar47,unaff_R12,(size_t)iterator->handle);
    if (iVar8 != 0) goto LAB_0011312d;
    pcVar47 = (char *)pfVar9->tree_cursor_start;
    unaff_R12 = (fdb_doc *)pfVar14->staletree;
    iVar8 = bcmp(pcVar47,unaff_R12,(size_t)pfVar9->hbtrie_iterator);
    pfVar15 = pfVar14;
    if (iVar8 != 0) goto LAB_00113148;
    pcVar47 = (char *)pfVar9->tree_cursor_prev;
    unaff_R12 = (fdb_doc *)(pfVar14->field_6).seqtree;
    iVar8 = bcmp(pcVar47,unaff_R12,(size_t)pfVar9->seqtree_iterator);
    if (iVar8 != 0) goto LAB_0011313d;
    fdb_doc_free((fdb_doc *)pfVar9);
    iterator = (fdb_iterator *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    fVar7 = fdb_iterator_next((fdb_iterator *)db);
    pfVar15 = db;
    pfVar48 = pfVar9;
  } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
  puVar6 = auStack_4d8;
  if ((uint8_t *)unaff_R13 != (uint8_t *)0xa) goto LAB_0011325f;
  pfVar9 = (fdb_iterator *)local_98[1]->key;
  sVar10 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar9,sVar10,'\0');
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113264;
  unaff_R13 = (char *)0x3;
  pfVar48 = pfVar9;
  do {
    fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
    pfVar9 = iterator;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011315e;
    pcVar47 = (char *)iterator->_seqnum;
    pfVar15 = (fdb_kvs_handle *)(&kvs_config.custom_cmp_param)[(long)unaff_R13];
    unaff_R12 = (fdb_doc *)pfVar15->op_stats;
    iVar8 = bcmp(pcVar47,unaff_R12,(size_t)iterator->handle);
    if (iVar8 != 0) goto LAB_00113153;
    pcVar47 = (char *)pfVar9->tree_cursor_start;
    unaff_R12 = (fdb_doc *)pfVar15->staletree;
    iVar8 = bcmp(pcVar47,unaff_R12,(size_t)pfVar9->hbtrie_iterator);
    if (iVar8 != 0) goto LAB_0011316e;
    pcVar47 = (char *)pfVar9->tree_cursor_prev;
    unaff_R12 = (fdb_doc *)(pfVar15->field_6).seqtree;
    iVar8 = bcmp(pcVar47,unaff_R12,(size_t)pfVar9->seqtree_iterator);
    if (iVar8 != 0) goto LAB_00113163;
    fdb_doc_free((fdb_doc *)pfVar9);
    iterator = (fdb_iterator *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    fVar7 = fdb_iterator_next((fdb_iterator *)db);
    pfVar48 = pfVar9;
  } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
  puVar6 = auStack_4d8;
  if ((uint8_t *)unaff_R13 != (uint8_t *)0xa) goto LAB_00113269;
  pfVar15 = (fdb_kvs_handle *)&db;
  fdb_iterator_close((fdb_iterator *)db);
  pfVar9 = (fdb_iterator *)(bodybuf + 0xf8);
  sprintf((char *)pfVar9,"key%d",4);
  unaff_R12 = (fdb_doc *)&fconfig.num_blocks_readahead;
  sprintf((char *)unaff_R12,"key%d",8);
  pcVar47 = (char *)dbfile;
  unaff_R13 = (char *)strlen((char *)pfVar9);
  sVar10 = strlen((char *)unaff_R12);
  uStack_4f0 = 0x112be2;
  fVar7 = fdb_iterator_init((fdb_kvs_handle *)pcVar47,(fdb_iterator **)pfVar15,pfVar9,
                            (size_t)unaff_R13,unaff_R12,sVar10,2);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011326e;
  fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)db);
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113273;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar16 = (fdb_kvs_handle *)iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113278;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_68->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  puVar6 = auStack_4d8;
  unaff_R12 = local_68;
  if (iVar8 != 0) goto LAB_0011327d;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar16)->tree_cursor_start;
  pcVar47 = (char *)local_68->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar16)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_00113288;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar16)->tree_cursor_prev;
  pcVar47 = (char *)local_68->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar16)->seqtree_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_00113293;
  fdb_doc_free((fdb_doc *)pfVar16);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011329e;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar15 = (fdb_kvs_handle *)iterator;
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132a3;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_98[2]->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  unaff_R12 = local_98[2];
  if (iVar8 != 0) goto LAB_001132a8;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_start;
  pcVar47 = (char *)local_98[2]->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->hbtrie_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001132b3;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_prev;
  pcVar47 = (char *)local_98[2]->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->seqtree_iterator);
  if (iVar8 != 0) goto LAB_001132be;
  fdb_doc_free((fdb_doc *)pfVar15);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_close((fdb_iterator *)db);
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132c9;
  uStack_4f0 = 0x112d56;
  fVar7 = fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,
                            0,0);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
  fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)db);
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar14 = (fdb_kvs_handle *)iterator;
  pcVar49 = (char *)local_60;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_60->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001132dd;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_start;
  pcVar47 = (char *)((fdb_doc *)pcVar49)->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_001132e8;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar14)->tree_cursor_prev;
  pcVar47 = (char *)((fdb_doc *)pcVar49)->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar14)->seqtree_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_001132f3;
  fdb_doc_free((fdb_doc *)pfVar14);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132fe;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar16 = (fdb_kvs_handle *)iterator;
  puVar6 = auStack_4d8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113303;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = *(char **)((long)kvs_config.custom_cmp_param + 0x20);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  pcVar49 = (char *)kvs_config.custom_cmp_param;
  if (iVar8 != 0) goto LAB_00113308;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar16)->tree_cursor_start;
  pcVar47 = *(char **)((long)kvs_config.custom_cmp_param + 0x38);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar16)->hbtrie_iterator);
  puVar6 = auStack_4d8;
  if (iVar8 != 0) goto LAB_00113313;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar16)->tree_cursor_prev;
  pcVar47 = *(char **)((long)kvs_config.custom_cmp_param + 0x40);
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar16)->seqtree_iterator);
  if (iVar8 != 0) goto LAB_0011331e;
  fdb_doc_free((fdb_doc *)pfVar16);
  iterator = (fdb_iterator *)0x0;
  pfVar16 = afStack_10458;
  memset(pfVar16,0xff,0xff80);
  fVar7 = fdb_iterator_seek((fdb_iterator *)db,pfVar16,0xff80,'\x01');
  pfVar17 = pfVar16;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113329;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar15 = (fdb_kvs_handle *)iterator;
  pfVar14 = pfVar16;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011332e;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_60->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  pcVar49 = (char *)local_60;
  if (iVar8 != 0) goto LAB_00113333;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_start;
  pcVar47 = (char *)local_60->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_0011333e;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar15)->tree_cursor_prev;
  pcVar47 = (char *)local_60->body;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar15)->seqtree_iterator);
  if (iVar8 != 0) goto LAB_00113349;
  fdb_doc_free((fdb_doc *)pfVar15);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_close((fdb_iterator *)db);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113354;
  pfVar15 = (fdb_kvs_handle *)0xfffffffffffffffe;
  do {
    fVar7 = fdb_del((fdb_kvs_handle *)dbfile,local_98[(long)pfVar15]);
    unaff_R12 = local_60;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113179;
    pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x2;
  } while (pfVar15 < (undefined1 *)0x8);
  fdb_commit((fdb_file_handle *)kv1,'\0');
  fdb_iterator_init((fdb_kvs_handle *)dbfile,(fdb_iterator **)&db,(void *)0x0,0,(void *)0x0,0,0);
  pfVar15 = db;
  iterator = (fdb_iterator *)0x0;
  pfVar9 = (fdb_iterator *)local_98[0]->key;
  sVar10 = strlen(bodybuf + 0xf8);
  fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar9,sVar10,'\0');
  if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113359;
  fVar7 = fdb_iterator_get((fdb_iterator *)db,(fdb_doc **)&iterator);
  pfVar17 = (fdb_kvs_handle *)iterator;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011335e;
  pfVar9 = (fdb_iterator *)iterator->_seqnum;
  pcVar47 = (char *)local_98[0]->key;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)iterator->handle);
  pcVar49 = (char *)local_98[0];
  if (iVar8 != 0) goto LAB_00113363;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_start;
  pcVar47 = (char *)local_98[0]->meta;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar17)->hbtrie_iterator);
  if (iVar8 != 0) goto LAB_0011336e;
  pfVar9 = (fdb_iterator *)((fdb_iterator *)pfVar17)->tree_cursor_prev;
  pcVar47 = (char *)local_98[0]->body;
  pfVar15 = (fdb_kvs_handle *)pcVar47;
  iVar8 = bcmp(pfVar9,pcVar47,(size_t)((fdb_iterator *)pfVar17)->seqtree_iterator);
  uVar55 = SUB84(pfVar15,0);
  if (iVar8 != 0) goto LAB_00113379;
  fdb_doc_free((fdb_doc *)pfVar17);
  iterator = (fdb_iterator *)0x0;
  fVar7 = fdb_iterator_close((fdb_iterator *)db);
  uVar13 = (uint)db;
  if (fVar7 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close(local_58);
    fdb_kvs_close((fdb_kvs_handle *)dbfile);
    fdb_close((fdb_file_handle *)kv1);
    lVar50 = 0;
    do {
      fdb_doc_free((fdb_doc *)(&kvs_config.custom_cmp_param)[lVar50]);
      lVar50 = lVar50 + 1;
    } while (lVar50 != 10);
    fdb_shutdown();
    memleak_end();
    pcVar47 = "%s PASSED\n";
    if (iterator_seek_test()::__test_pass != '\0') {
      pcVar47 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar47,"iterator seek test");
    return;
  }
  goto LAB_00113384;
LAB_00115083:
  fconfig_00 = (char *)&pfVar16[-3].filename;
  pcVar45 = (char *)(ulong)uVar13;
  pcVar47 = "key%06d";
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115093;
  iterator_complete_test();
LAB_00115093:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150a3;
  iterator_complete_test();
LAB_001150a3:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150b3;
  iterator_complete_test();
LAB_001150b3:
  pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150c3;
  iterator_complete_test();
LAB_001150c3:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150d3;
  iterator_complete_test();
LAB_001150d3:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150e3;
  iterator_complete_test();
LAB_001150e3:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150f3;
  iterator_complete_test();
LAB_001150f3:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150f8;
  iterator_complete_test();
LAB_001150f8:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1150fd;
  iterator_complete_test();
LAB_001150fd:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115102;
  iterator_complete_test();
LAB_00115102:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115107;
  iterator_complete_test();
LAB_00115107:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11510c;
  iterator_complete_test();
LAB_0011510c:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115111;
  iterator_complete_test();
LAB_00115111:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115116;
  iterator_complete_test();
LAB_00115116:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11511b;
  iterator_complete_test();
LAB_0011511b:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115120;
  iterator_complete_test();
LAB_00115120:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115125;
  iterator_complete_test();
LAB_00115125:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11512a;
  iterator_complete_test();
LAB_0011512a:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11512f;
  iterator_complete_test();
LAB_0011512f:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11513f;
  iterator_complete_test();
LAB_0011513f:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11514f;
  iterator_complete_test();
LAB_0011514f:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11515f;
  iterator_complete_test();
LAB_0011515f:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11516f;
  iterator_complete_test();
  pfVar17 = (fdb_kvs_handle *)unaff_R13;
LAB_0011516f:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115174;
  iterator_complete_test();
LAB_00115174:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115179;
  iterator_complete_test();
  pfVar14 = pfVar17;
LAB_00115179:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11517e;
  iterator_complete_test();
  pfVar17 = pfVar14;
LAB_0011517e:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115183;
  iterator_complete_test();
LAB_00115183:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115188;
  iterator_complete_test();
  pfVar14 = pfVar15;
LAB_00115188:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11518d;
  iterator_complete_test();
LAB_0011518d:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115192;
  iterator_complete_test();
LAB_00115192:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x115197;
  iterator_complete_test();
  unaff_R13 = (char *)pfVar17;
  pfVar15 = pfVar14;
LAB_00115197:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11519c;
  iterator_complete_test();
LAB_0011519c:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151a1;
  iterator_complete_test();
  goto LAB_001151a1;
LAB_00115708:
  pfVar16[-6].config.buffercache_size = 0x115715;
  iterator_extreme_key_test();
LAB_00115715:
  pfVar16[-6].config.buffercache_size = 0x115722;
  iterator_extreme_key_test();
LAB_00115722:
  pfVar15 = (fdb_kvs_handle *)&pfVar16[-6].config.seqtree_opt;
  pcVar47 = "0xff length %d";
  pcVar49 = (char *)&pfVar16[-6].config.compaction_cb_mask;
  pfVar16[-6].config.buffercache_size = 0x11572f;
  pfVar14 = (fdb_kvs_handle *)pcVar49;
  iterator_extreme_key_test();
  goto LAB_0011572f;
LAB_0011312d:
  iterator_seek_test();
  pfVar15 = pfVar14;
  pfVar48 = pfVar9;
LAB_00113138:
  pfVar9 = pfVar48;
  iterator_seek_test();
LAB_0011313d:
  iterator_seek_test();
LAB_00113148:
  iterator_seek_test();
LAB_00113153:
  iterator_seek_test();
  pfVar48 = pfVar9;
LAB_0011315e:
  pfVar9 = pfVar48;
  iterator_seek_test();
LAB_00113163:
  iterator_seek_test();
LAB_0011316e:
  iterator_seek_test();
LAB_00113179:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11317e;
  iterator_seek_test();
  pfVar14 = pfVar16;
LAB_0011317e:
  *(undefined8 *)((long)pfVar14 + -8) = 0x113183;
  iterator_seek_test();
  puVar6 = (undefined1 *)pfVar14;
LAB_00113183:
  puVar20 = puVar6;
  *(undefined8 *)(puVar20 + -8) = 0x113188;
  iterator_seek_test();
LAB_00113188:
  pfVar18 = unaff_R12;
  pfVar14 = pfVar15;
  *(undefined8 *)(puVar20 + -8) = 0x11318d;
  iterator_seek_test();
  puVar6 = puVar20;
LAB_0011318d:
  puVar21 = puVar6;
  *(undefined8 *)(puVar21 + -8) = 0x113198;
  iterator_seek_test();
LAB_00113198:
  *(undefined8 *)(puVar21 + -8) = 0x1131a3;
  iterator_seek_test();
  puVar6 = puVar21;
LAB_001131a3:
  puVar22 = puVar6;
  *(undefined8 *)(puVar22 + -8) = 0x1131ae;
  iterator_seek_test();
LAB_001131ae:
  *(undefined8 *)(puVar22 + -8) = 0x1131b3;
  iterator_seek_test();
  puVar6 = puVar22;
LAB_001131b3:
  pfVar51 = pfVar18;
  puVar23 = puVar6;
  pfVar15 = pfVar14;
  *(undefined8 *)(puVar23 + -8) = 0x1131b8;
  iterator_seek_test();
LAB_001131b8:
  *(undefined8 *)(puVar23 + -8) = 0x1131c3;
  iterator_seek_test();
  puVar6 = puVar23;
LAB_001131c3:
  puVar24 = puVar6;
  *(undefined8 *)(puVar24 + -8) = 0x1131ce;
  iterator_seek_test();
LAB_001131ce:
  *(undefined8 *)(puVar24 + -8) = 0x1131d9;
  iterator_seek_test();
  puVar6 = puVar24;
LAB_001131d9:
  puVar25 = puVar6;
  *(undefined8 *)(puVar25 + -8) = 0x1131de;
  iterator_seek_test();
LAB_001131de:
  pfVar18 = pfVar51;
  pfVar14 = pfVar15;
  *(undefined8 *)(puVar25 + -8) = 0x1131e3;
  iterator_seek_test();
  puVar6 = puVar25;
LAB_001131e3:
  puVar26 = puVar6;
  *(undefined8 *)(puVar26 + -8) = 0x1131ee;
  iterator_seek_test();
LAB_001131ee:
  *(undefined8 *)(puVar26 + -8) = 0x1131f9;
  iterator_seek_test();
  puVar6 = puVar26;
LAB_001131f9:
  puVar27 = puVar6;
  *(undefined8 *)(puVar27 + -8) = 0x113204;
  iterator_seek_test();
LAB_00113204:
  *(undefined8 *)(puVar27 + -8) = 0x113209;
  iterator_seek_test();
  puVar6 = puVar27;
LAB_00113209:
  pfVar51 = pfVar18;
  puVar28 = puVar6;
  pfVar15 = pfVar14;
  *(undefined8 *)(puVar28 + -8) = 0x11320e;
  iterator_seek_test();
LAB_0011320e:
  *(undefined8 *)(puVar28 + -8) = 0x113219;
  iterator_seek_test();
  puVar6 = puVar28;
LAB_00113219:
  puVar29 = puVar6;
  *(undefined8 *)(puVar29 + -8) = 0x113224;
  iterator_seek_test();
LAB_00113224:
  *(undefined8 *)(puVar29 + -8) = 0x11322f;
  iterator_seek_test();
  puVar6 = puVar29;
LAB_0011322f:
  puVar30 = puVar6;
  *(undefined8 *)(puVar30 + -8) = 0x113234;
  iterator_seek_test();
LAB_00113234:
  unaff_R12 = pfVar51;
  pfVar14 = pfVar15;
  *(undefined8 *)(puVar30 + -8) = 0x113239;
  iterator_seek_test();
  puVar6 = puVar30;
LAB_00113239:
  puVar31 = puVar6;
  *(undefined8 *)(puVar31 + -8) = 0x113244;
  iterator_seek_test();
LAB_00113244:
  *(undefined8 *)(puVar31 + -8) = 0x11324f;
  iterator_seek_test();
  puVar6 = puVar31;
LAB_0011324f:
  puVar32 = puVar6;
  *(undefined8 *)(puVar32 + -8) = 0x11325a;
  iterator_seek_test();
LAB_0011325a:
  *(undefined8 *)(puVar32 + -8) = 0x11325f;
  iterator_seek_test();
  puVar6 = puVar32;
LAB_0011325f:
  puVar33 = puVar6;
  pfVar15 = pfVar14;
  *(undefined8 *)(puVar33 + -8) = 0x113264;
  iterator_seek_test();
LAB_00113264:
  *(undefined8 *)(puVar33 + -8) = 0x113269;
  iterator_seek_test();
  puVar6 = puVar33;
LAB_00113269:
  puVar34 = puVar6;
  *(undefined8 *)(puVar34 + -8) = 0x11326e;
  iterator_seek_test();
LAB_0011326e:
  *(undefined8 *)(puVar34 + -8) = 0x113273;
  iterator_seek_test();
  puVar6 = puVar34;
LAB_00113273:
  puVar35 = puVar6;
  *(undefined8 *)(puVar35 + -8) = 0x113278;
  iterator_seek_test();
LAB_00113278:
  pfVar16 = pfVar15;
  *(undefined8 *)(puVar35 + -8) = 0x11327d;
  iterator_seek_test();
  puVar6 = puVar35;
LAB_0011327d:
  puVar36 = puVar6;
  *(undefined8 *)(puVar36 + -8) = 0x113288;
  iterator_seek_test();
LAB_00113288:
  *(undefined8 *)(puVar36 + -8) = 0x113293;
  iterator_seek_test();
  puVar6 = puVar36;
LAB_00113293:
  puVar37 = puVar6;
  *(undefined8 *)(puVar37 + -8) = 0x11329e;
  iterator_seek_test();
LAB_0011329e:
  *(undefined8 *)(puVar37 + -8) = 0x1132a3;
  iterator_seek_test();
  puVar6 = puVar37;
LAB_001132a3:
  puVar38 = puVar6;
  pfVar15 = pfVar16;
  *(undefined8 *)(puVar38 + -8) = 0x1132a8;
  iterator_seek_test();
LAB_001132a8:
  *(undefined8 *)(puVar38 + -8) = 0x1132b3;
  iterator_seek_test();
  puVar6 = puVar38;
LAB_001132b3:
  puVar39 = puVar6;
  *(undefined8 *)(puVar39 + -8) = 0x1132be;
  iterator_seek_test();
LAB_001132be:
  *(undefined8 *)(puVar39 + -8) = 0x1132c9;
  iterator_seek_test();
  puVar6 = puVar39;
LAB_001132c9:
  puVar40 = puVar6;
  *(undefined8 *)(puVar40 + -8) = 0x1132ce;
  iterator_seek_test();
LAB_001132ce:
  *(undefined8 *)(puVar40 + -8) = 0x1132d3;
  iterator_seek_test();
  puVar6 = puVar40;
LAB_001132d3:
  puVar41 = puVar6;
  *(undefined8 *)(puVar41 + -8) = 0x1132d8;
  iterator_seek_test();
  local_98[2] = unaff_R12;
LAB_001132d8:
  pcVar49 = (char *)local_98[2];
  pfVar14 = pfVar15;
  *(undefined8 *)(puVar41 + -8) = 0x1132dd;
  iterator_seek_test();
  puVar6 = puVar41;
LAB_001132dd:
  puVar42 = puVar6;
  *(undefined8 *)(puVar42 + -8) = 0x1132e8;
  iterator_seek_test();
LAB_001132e8:
  *(undefined8 *)(puVar42 + -8) = 0x1132f3;
  iterator_seek_test();
  puVar6 = puVar42;
LAB_001132f3:
  puVar43 = puVar6;
  *(undefined8 *)(puVar43 + -8) = 0x1132fe;
  iterator_seek_test();
LAB_001132fe:
  *(undefined8 *)(puVar43 + -8) = 0x113303;
  iterator_seek_test();
  puVar6 = puVar43;
LAB_00113303:
  puVar44 = puVar6;
  pfVar16 = pfVar14;
  *(undefined8 *)(puVar44 + -8) = 0x113308;
  iterator_seek_test();
LAB_00113308:
  *(undefined8 *)(puVar44 + -8) = 0x113313;
  iterator_seek_test();
  puVar6 = puVar44;
LAB_00113313:
  pfVar17 = (fdb_kvs_handle *)puVar6;
  *(undefined8 *)((long)pfVar17 + -8) = 0x11331e;
  iterator_seek_test();
LAB_0011331e:
  *(undefined8 *)((long)pfVar17 + -8) = 0x113329;
  iterator_seek_test();
LAB_00113329:
  pfVar17[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11332e;
  iterator_seek_test();
  pfVar14 = pfVar16;
  pfVar16 = pfVar17;
LAB_0011332e:
  pfVar15 = pfVar14;
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113333;
  iterator_seek_test();
LAB_00113333:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11333e;
  iterator_seek_test();
LAB_0011333e:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113349;
  iterator_seek_test();
LAB_00113349:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113354;
  iterator_seek_test();
LAB_00113354:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113359;
  iterator_seek_test();
LAB_00113359:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11335e;
  iterator_seek_test();
LAB_0011335e:
  pfVar17 = pfVar15;
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113363;
  iterator_seek_test();
LAB_00113363:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11336e;
  iterator_seek_test();
LAB_0011336e:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113379;
  iterator_seek_test();
LAB_00113379:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)0x113384;
  pfVar48 = pfVar9;
  pfVar15 = (fdb_kvs_handle *)pcVar47;
  iterator_seek_test();
  uVar13 = (uint)pfVar15;
  uVar55 = SUB84(pfVar48,0);
LAB_00113384:
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)iterator_complete_test;
  iterator_seek_test();
  pfVar16[-1].bub_ctx.handle = (fdb_kvs_handle *)&stack0xfffffffffffffff8;
  pfVar16[-1].bub_ctx.space_used = (uint64_t)pcVar47;
  pfVar16[-1].bub_ctx.num_entries = (uint64_t)pfVar9;
  pfVar16[-1].bub_ctx.entries = (list *)unaff_R13;
  *(char **)&pfVar16[-1].num_iterators = pcVar49;
  pfVar16[-1].node = (kvs_opened_node *)pfVar17;
  *(undefined4 *)(pfVar16[-3].config.encryption_key.bytes + 0x10) = uVar55;
  pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1133b0;
  gettimeofday((timeval *)&pfVar16[-1].config.compaction_cb_mask,(__timezone_ptr_t)0x0);
  pfVar16[-3].config.num_bgflusher_threads = 0;
  pfVar16[-2].node = (kvs_opened_node *)0x202066722d206d72;
  *(undefined8 *)&pfVar16[-2].num_iterators = 0x726f746172657469;
  *(undefined8 *)&pfVar16[-2].field_0x1e7 = 0x2a747365745f72;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1133de;
  system((char *)&pfVar16[-2].node);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1133e3;
  memleak_start();
  fconfig_00 = (char *)&pfVar16[-1].config.max_writer_lock_prob;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1133f3;
  fdb_get_default_config();
  *(undefined4 *)((long)&pfVar16[-1].config.num_bgflusher_threads + 4) = 1;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x113407;
  fdb_get_default_kvs_config();
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11341b;
  fVar7 = fdb_open((fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4),
                   "./iterator_test",(fdb_config *)fconfig_00);
  if (fVar7 != FDB_RESULT_SUCCESS) {
LAB_001151a6:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151ab;
    iterator_complete_test();
LAB_001151ab:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151b0;
    iterator_complete_test();
LAB_001151b0:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151b5;
    iterator_complete_test();
LAB_001151b5:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151ba;
    iterator_complete_test();
LAB_001151ba:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151bf;
    iterator_complete_test();
LAB_001151bf:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151c4;
    iterator_complete_test();
LAB_001151c4:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151c9;
    iterator_complete_test();
LAB_001151c9:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151ce;
    iterator_complete_test();
LAB_001151ce:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151d3;
    iterator_complete_test();
LAB_001151d3:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151d8;
    iterator_complete_test();
LAB_001151d8:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151dd;
    iterator_complete_test();
LAB_001151dd:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151e2;
    iterator_complete_test();
LAB_001151e2:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151e7;
    iterator_complete_test();
LAB_001151e7:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151ec;
    iterator_complete_test();
LAB_001151ec:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151f1;
    iterator_complete_test();
LAB_001151f1:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151f6;
    iterator_complete_test();
LAB_001151f6:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151fb;
    iterator_complete_test();
LAB_001151fb:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115200;
    iterator_complete_test();
LAB_00115200:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115205;
    iterator_complete_test();
LAB_00115205:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115215;
    iterator_complete_test();
LAB_00115215:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11521a;
    iterator_complete_test();
LAB_0011521a:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11521f;
    iterator_complete_test();
LAB_0011521f:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115224;
    iterator_complete_test();
LAB_00115224:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115229;
    iterator_complete_test();
LAB_00115229:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115239;
    iterator_complete_test();
LAB_00115239:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11523e;
    iterator_complete_test();
LAB_0011523e:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115243;
    iterator_complete_test();
LAB_00115243:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115248;
    iterator_complete_test();
    pfVar17 = (fdb_kvs_handle *)unaff_R13;
LAB_00115248:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11524d;
    iterator_complete_test();
LAB_0011524d:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115252;
    iterator_complete_test();
LAB_00115252:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115257;
    iterator_complete_test();
LAB_00115257:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11525c;
    iterator_complete_test();
LAB_0011525c:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115261;
    iterator_complete_test();
LAB_00115261:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115266;
    iterator_complete_test();
LAB_00115266:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11526b;
    iterator_complete_test();
    pfVar14 = pfVar15;
LAB_0011526b:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115270;
    iterator_complete_test();
LAB_00115270:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115275;
    iterator_complete_test();
    pfVar15 = pfVar14;
LAB_00115275:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11527a;
    iterator_complete_test();
LAB_0011527a:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11527f;
    iterator_complete_test();
LAB_0011527f:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115284;
    iterator_complete_test();
LAB_00115284:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115289;
    iterator_complete_test();
LAB_00115289:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11528e;
    iterator_complete_test();
LAB_0011528e:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115293;
    iterator_complete_test();
LAB_00115293:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115298;
    iterator_complete_test();
LAB_00115298:
    pfVar16[-3].config.compaction_cb_ctx = iterator_extreme_key_test;
    iterator_complete_test();
    pfVar16[-3].config.compaction_cb_ctx = pcVar47;
    *(fdb_kvs_handle **)&pfVar16[-3].config.compaction_cb_mask = pfVar15;
    pfVar16[-3].config.compaction_cb = (fdb_compaction_callback)pfVar17;
    *(char **)&pfVar16[-3].config.num_wal_partitions = pcVar49;
    pfVar16[-3].config.prefetch_duration = (uint64_t)fconfig_00;
    pfVar16[-6].config.buffercache_size = 0x1152b9;
    gettimeofday((timeval *)&pfVar16[-6].config.num_wal_partitions,(__timezone_ptr_t)0x0);
    pfVar16[-6].config.seqtree_opt = '\0';
    pfVar16[-6].config.durability_opt = '\0';
    *(undefined2 *)&pfVar16[-6].config.field_0x22 = 0;
    pfVar16[-6].config.flags = 0;
    pfVar16[-4].filename = (char *)0x202066722d206d72;
    pfVar16[-4].txn = (fdb_txn *)0x726f746172657469;
    *(undefined8 *)((long)&pfVar16[-4].txn + 7) = 0x2a747365745f72;
    pfVar16[-6].config.buffercache_size = 0x1152e7;
    system((char *)&pfVar16[-4].filename);
    pfVar16[-6].config.buffercache_size = 0x1152ec;
    memleak_start();
    fconfig_01 = (atomic<unsigned_char> *)&pfVar16[-5].config.compaction_cb_mask;
    pfVar16[-6].config.buffercache_size = 0x1152fc;
    fdb_get_default_config();
    pfVar16[-6].config.buffercache_size = 0x115306;
    fdb_get_default_kvs_config();
    pfVar14 = (fdb_kvs_handle *)&pfVar16[-6].config.compaction_minimum_filesize;
    pfVar16[-6].config.buffercache_size = 0x11531a;
    fVar7 = fdb_open((fdb_file_handle **)pfVar14,"./iterator_test",(fdb_config *)fconfig_01);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      pfVar14 = (fdb_kvs_handle *)pfVar16[-6].config.compaction_minimum_filesize;
      pfVar16[-6].config.buffercache_size = 0x115338;
      fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar14,
                           (fdb_kvs_handle **)&pfVar16[-6].config.compaction_buf_maxsize,(char *)0x0
                           ,(fdb_kvs_config *)&pfVar16[-6].config.compactor_sleep_duration);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115734;
      fconfig_01 = &pfVar16[-6].handle_busy;
      pfVar16[-6].config.buffercache_size = 0x11535a;
      memset(fconfig_01,0xff,0x100);
      uVar46 = 1;
      pcVar47 = "0xff length %d";
      pcVar49 = (char *)&pfVar16[-6].config.compaction_cb_mask;
      do {
        pfVar16[-6].config.buffercache_size = 0x11537c;
        sprintf(pcVar49,"0xff length %d",uVar46 & 0xffffffff);
        pfVar17 = *(fdb_kvs_handle **)&pfVar16[-6].config.compaction_buf_maxsize;
        pfVar16[-6].config.buffercache_size = 0x115389;
        sVar10 = strlen(pcVar49);
        pfVar16[-6].config.buffercache_size = 0x11539e;
        fdb_set_kv(pfVar17,fconfig_01,uVar46,pcVar49,sVar10 + 1);
        uVar46 = uVar46 + 1;
      } while (uVar46 != 0x1e);
      pfVar1 = (fdb_file_handle *)pfVar16[-6].config.compaction_minimum_filesize;
      pfVar16[-6].config.buffercache_size = 0x1153b6;
      fdb_commit(pfVar1,'\x01');
      pfVar16[-6].config.wal_threshold = 0;
      pfVar14 = (fdb_kvs_handle *)&pfVar16[-6].config.seqtree_opt;
      pfVar16[-6].config.buffercache_size = 0x1153d4;
      fVar7 = fdb_doc_create((fdb_doc **)pfVar14,(void *)0x0,0,(void *)0x0,0,(void *)0x0,
                             pfVar16[-6].config.wal_threshold);
      pfVar15 = (fdb_kvs_handle *)0x1e;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115739;
      lVar50 = *(long *)&pfVar16[-6].config.seqtree_opt;
      *(uint16_t **)(lVar50 + 0x20) = &pfVar16[-4].config.num_wal_partitions;
      *(undefined8 *)(lVar50 + 0x38) = 0;
      *(fdb_txn ***)(lVar50 + 0x40) = &pfVar16[-5].txn;
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.compaction_buf_maxsize;
      *(undefined4 *)&pfVar16[-6].config.wal_threshold = 0;
      pfVar16[-6].config.buffercache_size = 0x115421;
      fVar7 = fdb_iterator_init(pfVar14,(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit
                                ,(void *)0x0,0,(void *)0x0,0,
                                (fdb_iterator_opt_t)pfVar16[-6].config.wal_threshold);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011573e;
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.wal_flush_before_commit;
      pfVar16[-6].config.buffercache_size = 0x115433;
      fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar14);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115743;
      fconfig_01 = (atomic<unsigned_char> *)0x1d;
      do {
        pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
        pfVar16[-6].config.buffercache_size = 0x11545e;
        fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-6].config.seqtree_opt);
        if (fVar7 != FDB_RESULT_SUCCESS) break;
        pfVar16[-6].config.buffercache_size = 0x115471;
        sprintf((char *)&pfVar16[-6].config.compaction_cb_mask,"0xff length %d",fconfig_01);
        sVar10 = *(size_t *)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x10);
        pfVar17 = *(fdb_kvs_handle **)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x40);
        pfVar16[-6].config.buffercache_size = 0x115489;
        iVar8 = bcmp(pfVar17,&pfVar16[-6].config.compaction_cb_mask,sVar10);
        if (iVar8 != 0) {
          pfVar16[-6].config.buffercache_size = 0x115708;
          iterator_extreme_key_test();
          goto LAB_00115708;
        }
        pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
        pfVar16[-6].config.buffercache_size = 0x11549b;
        fVar7 = fdb_iterator_prev(pfVar9);
        fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
      } while (fVar7 == FDB_RESULT_SUCCESS);
      pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
      pfVar16[-6].config.buffercache_size = 0x1154bd;
      fVar7 = fdb_iterator_seek(pfVar9,&pfVar16[-6].handle_busy,8,'\x01');
      if (fVar7 == FDB_RESULT_SUCCESS) {
        fconfig_01 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
          pfVar16[-6].config.buffercache_size = 0x1154e4;
          fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-6].config.seqtree_opt);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          pfVar16[-6].config.buffercache_size = 0x1154f7;
          sprintf((char *)&pfVar16[-6].config.compaction_cb_mask,"0xff length %d",fconfig_01);
          sVar10 = *(size_t *)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x10);
          pfVar17 = *(fdb_kvs_handle **)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x40);
          pfVar16[-6].config.buffercache_size = 0x11550f;
          iVar8 = bcmp(pfVar17,&pfVar16[-6].config.compaction_cb_mask,sVar10);
          if (iVar8 != 0) goto LAB_00115715;
          pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
          pfVar16[-6].config.buffercache_size = 0x115521;
          fVar7 = fdb_iterator_prev(pfVar9);
          fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
        } while (fVar7 == FDB_RESULT_SUCCESS);
      }
      pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
      pfVar16[-6].config.buffercache_size = 0x115543;
      fVar7 = fdb_iterator_seek(pfVar9,&pfVar16[-6].handle_busy,8,'\x01');
      if (fVar7 == FDB_RESULT_SUCCESS) {
        fconfig_01 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
          pfVar16[-6].config.buffercache_size = 0x11556a;
          fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-6].config.seqtree_opt);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          pfVar16[-6].config.buffercache_size = 0x11557d;
          sprintf((char *)&pfVar16[-6].config.compaction_cb_mask,"0xff length %d",fconfig_01);
          sVar10 = *(size_t *)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x10);
          pfVar17 = *(fdb_kvs_handle **)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x40);
          pfVar16[-6].config.buffercache_size = 0x115595;
          iVar8 = bcmp(pfVar17,&pfVar16[-6].config.compaction_cb_mask,sVar10);
          if (iVar8 != 0) goto LAB_00115722;
          pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
          pfVar16[-6].config.buffercache_size = 0x1155a7;
          fVar7 = fdb_iterator_next(pfVar9);
          fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 + 1);
        } while (fVar7 == FDB_RESULT_SUCCESS);
      }
      pfVar15 = (fdb_kvs_handle *)&pfVar16[-6].config.seqtree_opt;
      pcVar49 = (char *)&pfVar16[-6].config.compaction_cb_mask;
      pcVar47 = "0xff length %d";
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.wal_flush_before_commit;
      pfVar16[-6].config.buffercache_size = 0x1155b7;
      fVar7 = fdb_iterator_close((fdb_iterator *)pfVar14);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115748;
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.compaction_buf_maxsize;
      *(undefined4 *)&pfVar16[-6].config.wal_threshold = 0;
      pfVar16[-6].config.buffercache_size = 0x1155e7;
      fVar7 = fdb_iterator_init(pfVar14,(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit
                                ,(void *)0x0,0,&pfVar16[-6].handle_busy,0x100,
                                (fdb_iterator_opt_t)pfVar16[-6].config.wal_threshold);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011574d;
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.wal_flush_before_commit;
      pfVar16[-6].config.buffercache_size = 0x1155f9;
      fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar14);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115752;
      fconfig_01 = (atomic<unsigned_char> *)0x1d;
      pfVar15 = (fdb_kvs_handle *)&pfVar16[-6].config.seqtree_opt;
      pcVar47 = "0xff length %d";
      pcVar49 = (char *)&pfVar16[-6].config.compaction_cb_mask;
      do {
        pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
        pfVar16[-6].config.buffercache_size = 0x115624;
        fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)pfVar15);
        if (fVar7 != FDB_RESULT_SUCCESS) break;
        pfVar16[-6].config.buffercache_size = 0x115637;
        sprintf(pcVar49,"0xff length %d",fconfig_01);
        sVar10 = *(size_t *)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x10);
        pfVar17 = *(fdb_kvs_handle **)(*(long *)&pfVar16[-6].config.seqtree_opt + 0x40);
        pfVar16[-6].config.buffercache_size = 0x11564f;
        iVar8 = bcmp(pfVar17,pcVar49,sVar10);
        if (iVar8 != 0) goto LAB_00115708;
        pfVar9 = *(fdb_iterator **)&pfVar16[-6].config.wal_flush_before_commit;
        pfVar16[-6].config.buffercache_size = 0x115661;
        fVar7 = fdb_iterator_prev(pfVar9);
        fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
      } while (fVar7 == FDB_RESULT_SUCCESS);
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.wal_flush_before_commit;
      pfVar16[-6].config.buffercache_size = 0x115671;
      fVar7 = fdb_iterator_close((fdb_iterator *)pfVar14);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115757;
      pfVar14 = (fdb_kvs_handle *)pfVar16[-6].config.compaction_minimum_filesize;
      pfVar16[-6].config.buffercache_size = 0x115683;
      fVar7 = fdb_close((fdb_file_handle *)pfVar14);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011575c;
      pfVar14 = *(fdb_kvs_handle **)&pfVar16[-6].config.seqtree_opt;
      pfVar14->op_stats = (kvs_ops_stat *)0x0;
      (pfVar14->field_6).seqtree = (btree *)0x0;
      pfVar16[-6].config.buffercache_size = 0x11569f;
      fVar7 = fdb_doc_free((fdb_doc *)pfVar14);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115761;
      pfVar16[-6].config.buffercache_size = 0x1156ac;
      fVar7 = fdb_shutdown();
      if (fVar7 == FDB_RESULT_SUCCESS) {
        pfVar16[-6].config.buffercache_size = 0x1156b9;
        memleak_end();
        pcVar47 = "%s PASSED\n";
        if (iterator_extreme_key_test()::__test_pass != '\0') {
          pcVar47 = "%s FAILED\n";
        }
        pfVar16[-6].config.buffercache_size = 0x1156ea;
        fprintf(_stderr,pcVar47,"iterator extreme key test");
        return;
      }
    }
    else {
LAB_0011572f:
      pfVar16[-6].config.buffercache_size = 0x115734;
      iterator_extreme_key_test();
LAB_00115734:
      pfVar16[-6].config.buffercache_size = 0x115739;
      iterator_extreme_key_test();
LAB_00115739:
      pfVar16[-6].config.buffercache_size = 0x11573e;
      iterator_extreme_key_test();
LAB_0011573e:
      pfVar16[-6].config.buffercache_size = 0x115743;
      iterator_extreme_key_test();
LAB_00115743:
      pfVar16[-6].config.buffercache_size = 0x115748;
      iterator_extreme_key_test();
LAB_00115748:
      pfVar16[-6].config.buffercache_size = 0x11574d;
      iterator_extreme_key_test();
LAB_0011574d:
      pfVar16[-6].config.buffercache_size = 0x115752;
      iterator_extreme_key_test();
LAB_00115752:
      pfVar16[-6].config.buffercache_size = 0x115757;
      iterator_extreme_key_test();
LAB_00115757:
      pfVar16[-6].config.buffercache_size = 0x11575c;
      iterator_extreme_key_test();
LAB_0011575c:
      pfVar16[-6].config.buffercache_size = 0x115761;
      iterator_extreme_key_test();
LAB_00115761:
      pfVar16[-6].config.buffercache_size = 0x115766;
      iterator_extreme_key_test();
    }
    pfVar16[-6].config.buffercache_size = (uint64_t)iterator_inmem_snapshot_seek_test;
    iterator_extreme_key_test();
    pfVar16[-6].config.buffercache_size = (uint64_t)pcVar45;
    *(char **)&pfVar16[-6].config = pcVar47;
    pfVar16[-6].fileops = (filemgr_ops *)pfVar15;
    pfVar16[-6].btreeblkops = (btree_blk_ops *)pfVar17;
    pfVar16[-6].bhandle = (btreeblk_handle *)pcVar49;
    pfVar16[-6].dhandle = (docio_handle *)fconfig_01;
    sVar10 = (ulong)pfVar14 & 0xffffffff;
    pvVar53 = (void *)0x0;
    pfVar16[-9].node = (kvs_opened_node *)0x115790;
    gettimeofday((timeval *)&pfVar16[-8].bhandle,(__timezone_ptr_t)0x0);
    pfVar16[-9].node = (kvs_opened_node *)0x115795;
    memleak_start();
    pfVar16[-9].bub_ctx.num_entries = 0;
    pfVar16[-9].node = (kvs_opened_node *)0x1157a6;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar18 = (fdb_doc *)&pfVar16[-7].config.num_blocks_readahead;
    pfVar16[-9].node = (kvs_opened_node *)0x1157b6;
    fdb_get_default_config();
    pfVar16[-9].node = (kvs_opened_node *)0x1157c0;
    fdb_get_default_kvs_config();
    pfVar16[-7].log_callback.callback = (fdb_log_callback)0x0;
    pfVar16[-7].log_callback.callback_ex = (fdb_log_callback_ex)0x400;
    *(undefined4 *)
     ((long)&pfVar16[-7].cur_header_revnum.super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(undefined1 *)((long)&pfVar16[-7].rollback_revnum + 7) = 0;
    pfVar16[-9].node = (kvs_opened_node *)0x1157eb;
    fVar7 = fdb_open((fdb_file_handle **)(pfVar16 + -8),"./iterator_test1",(fdb_config *)pfVar18);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(int *)((long)&pfVar16[-8].kvs_config.custom_cmp + 4) = (int)pfVar14;
      pfVar15 = *(fdb_kvs_handle **)&pfVar16[-8].kvs_config;
      pfVar16[-9].node = (kvs_opened_node *)0x11580b;
      fVar7 = fdb_kvs_open_default
                        ((fdb_file_handle *)pfVar15,&pfVar16[-9].bub_ctx.handle,
                         (fdb_kvs_config *)&pfVar16[-8].kvs_config.custom_cmp_param);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c00;
      pfVar17 = (fdb_kvs_handle *)0x0;
      uVar46 = 0;
      do {
        pfVar16[-9].node = (kvs_opened_node *)0x115836;
        sprintf((char *)&pfVar16[-7].btreeblkops,"%c2",(ulong)((int)uVar46 + 0x61));
        pfVar16[-9].node = (kvs_opened_node *)0x11584f;
        sprintf((char *)&pfVar16[-8].log_callback,"meta%d",uVar46 & 0xffffffff);
        pfVar16[-9].node = (kvs_opened_node *)0x115868;
        sprintf((char *)&pfVar16[-8].fileops,"body%d",uVar46 & 0xffffffff);
        pcVar49 = (char *)((long)pfVar17 + (long)&pfVar16[-8].fhandle);
        pfVar16[-9].node = (kvs_opened_node *)0x115878;
        sVar10 = strlen((char *)&pfVar16[-7].btreeblkops);
        pfVar18 = (fdb_doc *)&pfVar16[-8].log_callback;
        pfVar16[-9].node = (kvs_opened_node *)0x11588b;
        pcVar47 = (char *)strlen((char *)pfVar18);
        pfVar16[-9].node = (kvs_opened_node *)0x11589b;
        sVar11 = strlen((char *)&pfVar16[-8].fileops);
        *(size_t *)&pfVar16[-9].num_iterators = sVar11;
        pfVar16[-9].node = (kvs_opened_node *)0x1158c0;
        fdb_doc_create((fdb_doc **)pcVar49,&pfVar16[-7].btreeblkops,sVar10,pfVar18,(size_t)pcVar47,
                       &pfVar16[-8].fileops,*(size_t *)&pfVar16[-9].num_iterators);
        pfVar15 = pfVar16[-9].bub_ctx.handle;
        pfVar51 = *(fdb_doc **)((long)pfVar16 + uVar46 * 8 + -0x1018);
        pfVar16[-9].node = (kvs_opened_node *)0x1158cf;
        fdb_set(pfVar15,pfVar51);
        uVar46 = uVar46 + 1;
        pfVar17 = (fdb_kvs_handle *)((long)pfVar17 + 8);
      } while (uVar46 != 5);
      pfVar15 = *(fdb_kvs_handle **)&pfVar16[-8].kvs_config;
      opt = *(fdb_commit_opt_t *)((long)&pfVar16[-8].kvs_config.custom_cmp + 4);
      pfVar16[-9].node = (kvs_opened_node *)0x1158ef;
      fdb_commit((fdb_file_handle *)pfVar15,opt);
      pfVar15 = pfVar16[-9].bub_ctx.handle;
      pfVar16[-9].node = (kvs_opened_node *)0x115905;
      fVar7 = fdb_snapshot_open(pfVar15,(fdb_kvs_handle **)&pfVar16[-9].bub_ctx.space_used,
                                0xffffffffffffffff);
      pvVar53 = (void *)0x5;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c05;
      pfVar15 = pfVar16[-9].bub_ctx.handle;
      pfVar16[-9].node = (kvs_opened_node *)0x115925;
      fVar7 = fdb_set_log_callback(pfVar15,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c0a;
      pfVar15 = (fdb_kvs_handle *)pfVar16[-9].bub_ctx.space_used;
      pfVar16[-9].num_iterators = 0xe;
      pfVar18 = (fdb_doc *)&pfVar16[-9].bub_ctx;
      pfVar16[-9].node = (kvs_opened_node *)0x11595f;
      fdb_iterator_init(pfVar15,(fdb_iterator **)pfVar18,"b2",2,"d2",2,
                        (fdb_iterator_opt_t)pfVar16[-9].num_iterators);
      pfVar9 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar18)->entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115978;
      fVar7 = fdb_iterator_seek(pfVar9,"c1",2,'\x01');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c0f;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115999;
      fVar7 = fdb_iterator_seek(pfVar9,"c3",2,'\0');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c14;
      pfVar18 = (fdb_doc *)&pfVar16[-9].bub_ctx;
      pfVar9 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar18)->entries;
      pfVar16[-9].node = (kvs_opened_node *)0x1159af;
      fdb_iterator_close(pfVar9);
      pfVar15 = (fdb_kvs_handle *)pfVar16[-9].bub_ctx.space_used;
      pfVar16[-9].num_iterators = 0xe;
      pfVar16[-9].node = (kvs_opened_node *)0x1159dc;
      fdb_iterator_init(pfVar15,(fdb_iterator **)pfVar18,"b3",2,"d1",2,
                        (fdb_iterator_opt_t)pfVar16[-9].num_iterators);
      pfVar9 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar18)->entries;
      pfVar16[-9].node = (kvs_opened_node *)0x1159f5;
      fVar7 = fdb_iterator_seek(pfVar9,"c1",2,'\x01');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c19;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115a16;
      fVar7 = fdb_iterator_seek(pfVar9,"c3",2,'\0');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c1e;
      pfVar18 = (fdb_doc *)&pfVar16[-9].bub_ctx;
      pfVar9 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar18)->entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115a2c;
      fdb_iterator_close(pfVar9);
      pfVar15 = (fdb_kvs_handle *)pfVar16[-9].bub_ctx.space_used;
      pfVar16[-9].num_iterators = 0xe;
      pfVar16[-9].node = (kvs_opened_node *)0x115a59;
      fdb_iterator_init(pfVar15,(fdb_iterator **)pfVar18,"b0",2,"e2",2,
                        (fdb_iterator_opt_t)pfVar16[-9].num_iterators);
      pfVar9 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar18)->entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115a61;
      fVar7 = fdb_iterator_seek_to_max(pfVar9);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c23;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115a78;
      fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-9].bub_ctx.num_entries);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c28;
      pfVar18 = (fdb_doc *)pfVar16[-9].bub_ctx.num_entries;
      sVar11 = pfVar18->keylen;
      pvVar53 = pfVar18->key;
      pfVar16[-9].node = (kvs_opened_node *)0x115a9b;
      iVar8 = bcmp(pvVar53,"d2",sVar11);
      if (iVar8 != 0) goto LAB_00115c2d;
      pfVar16[-9].node = (kvs_opened_node *)0x115aab;
      fdb_doc_free(pfVar18);
      pfVar16[-9].bub_ctx.num_entries = 0;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115acc;
      fVar7 = fdb_iterator_seek(pfVar9,"e2",2,'\0');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c35;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115adf;
      fVar7 = fdb_iterator_seek_to_min(pfVar9);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c3a;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115af6;
      fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-9].bub_ctx.num_entries);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c3f;
      pfVar18 = (fdb_doc *)pfVar16[-9].bub_ctx.num_entries;
      sVar11 = pfVar18->keylen;
      pvVar53 = pfVar18->key;
      pfVar16[-9].node = (kvs_opened_node *)0x115b19;
      iVar8 = bcmp(pvVar53,"c2",sVar11);
      if (iVar8 != 0) goto LAB_00115c44;
      pfVar16[-9].node = (kvs_opened_node *)0x115b29;
      fdb_doc_free(pfVar18);
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115b44;
      fVar7 = fdb_iterator_seek(pfVar9,"b0",2,'\x01');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c4c;
      pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
      pfVar16[-9].node = (kvs_opened_node *)0x115b68;
      fVar7 = fdb_iterator_seek(pfVar9,"b0",2,'\x01');
      if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar9 = (fdb_iterator *)pfVar16[-9].bub_ctx.entries;
        pfVar16[-9].node = (kvs_opened_node *)0x115b7b;
        fdb_iterator_close(pfVar9);
        pfVar15 = pfVar16[-9].bub_ctx.handle;
        pfVar16[-9].node = (kvs_opened_node *)0x115b85;
        fdb_kvs_close(pfVar15);
        pfVar15 = (fdb_kvs_handle *)pfVar16[-9].bub_ctx.space_used;
        pfVar16[-9].node = (kvs_opened_node *)0x115b8f;
        fdb_kvs_close(pfVar15);
        pfVar15 = *(fdb_kvs_handle **)&pfVar16[-8].kvs_config;
        pfVar16[-9].node = (kvs_opened_node *)0x115b99;
        fdb_close((fdb_file_handle *)pfVar15);
        lVar50 = 0;
        do {
          pfVar18 = *(fdb_doc **)((long)pfVar16 + lVar50 * 8 + -0x1018);
          pfVar16[-9].node = (kvs_opened_node *)0x115ba5;
          fdb_doc_free(pfVar18);
          lVar50 = lVar50 + 1;
        } while (lVar50 != 5);
        pfVar16[-9].node = (kvs_opened_node *)0x115bb3;
        fdb_shutdown();
        pfVar16[-9].node = (kvs_opened_node *)0x115bb8;
        memleak_end();
        pcVar47 = "%s PASSED\n";
        if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
          pcVar47 = "%s FAILED\n";
        }
        pfVar16[-9].node = (kvs_opened_node *)0x115be9;
        fprintf(_stderr,pcVar47,"in-memory snapshot seek test");
        return;
      }
    }
    else {
      pfVar16[-9].node = (kvs_opened_node *)0x115c00;
      iterator_inmem_snapshot_seek_test();
LAB_00115c00:
      pfVar16[-9].node = (kvs_opened_node *)0x115c05;
      iterator_inmem_snapshot_seek_test();
LAB_00115c05:
      pfVar16[-9].node = (kvs_opened_node *)0x115c0a;
      iterator_inmem_snapshot_seek_test();
LAB_00115c0a:
      pfVar16[-9].node = (kvs_opened_node *)0x115c0f;
      iterator_inmem_snapshot_seek_test();
LAB_00115c0f:
      pfVar16[-9].node = (kvs_opened_node *)0x115c14;
      iterator_inmem_snapshot_seek_test();
LAB_00115c14:
      pfVar16[-9].node = (kvs_opened_node *)0x115c19;
      iterator_inmem_snapshot_seek_test();
LAB_00115c19:
      pfVar16[-9].node = (kvs_opened_node *)0x115c1e;
      iterator_inmem_snapshot_seek_test();
LAB_00115c1e:
      pfVar16[-9].node = (kvs_opened_node *)0x115c23;
      iterator_inmem_snapshot_seek_test();
LAB_00115c23:
      pfVar16[-9].node = (kvs_opened_node *)0x115c28;
      iterator_inmem_snapshot_seek_test();
LAB_00115c28:
      pfVar16[-9].node = (kvs_opened_node *)0x115c2d;
      iterator_inmem_snapshot_seek_test();
LAB_00115c2d:
      pfVar16[-9].node = (kvs_opened_node *)0x115c35;
      iterator_inmem_snapshot_seek_test();
LAB_00115c35:
      pfVar16[-9].node = (kvs_opened_node *)0x115c3a;
      iterator_inmem_snapshot_seek_test();
LAB_00115c3a:
      pfVar16[-9].node = (kvs_opened_node *)0x115c3f;
      iterator_inmem_snapshot_seek_test();
LAB_00115c3f:
      pfVar16[-9].node = (kvs_opened_node *)0x115c44;
      iterator_inmem_snapshot_seek_test();
LAB_00115c44:
      pfVar16[-9].node = (kvs_opened_node *)0x115c4c;
      iterator_inmem_snapshot_seek_test();
LAB_00115c4c:
      pfVar16[-9].node = (kvs_opened_node *)0x115c51;
      iterator_inmem_snapshot_seek_test();
    }
    pfVar16[-9].node = (kvs_opened_node *)iterator_no_deletes_test;
    iterator_inmem_snapshot_seek_test();
    pfVar16[-9].node = (kvs_opened_node *)sVar10;
    *(char **)&pfVar16[-9].handle_busy = pcVar47;
    pfVar16[-9].txn = (fdb_txn *)pvVar53;
    pfVar16[-9].filename = (char *)pfVar17;
    pfVar16[-9].max_seqnum = (fdb_seqnum_t)pcVar49;
    pfVar16[-9].seqnum = (fdb_seqnum_t)pfVar18;
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c76;
    gettimeofday((timeval *)&pfVar16[-10].config.seqtree_opt,(__timezone_ptr_t)0x0);
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c7b;
    memleak_start();
    pfVar16[-10].op_stats = (kvs_ops_stat *)0x0;
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115c90;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115ca0;
    fdb_get_default_config();
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115cb0;
    fdb_get_default_kvs_config();
    pfVar16[-10].config.compaction_cb = (fdb_compaction_callback)0x400;
    *(undefined4 *)((long)&pfVar16[-10].config.compaction_cb_ctx + 4) = 1;
    *(undefined1 *)((long)&pfVar16[-10].config.max_writer_lock_prob + 7) = 0;
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115cda;
    fdb_open((fdb_file_handle **)&pfVar16[-10].staletree,"./iterator_test",
             (fdb_config *)&pfVar16[-10].config.prefetch_duration);
    pbVar2 = pfVar16[-10].staletree;
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115cf1;
    fdb_kvs_open((fdb_file_handle *)pbVar2,(fdb_kvs_handle **)&pfVar16[-10].fhandle,"all_docs",
                 (fdb_kvs_config *)&pfVar16[-10].config.compaction_minimum_filesize);
    __s = &pfVar16[-9].config.compactor_sleep_duration;
    __s_00 = &pfVar16[-10].seqnum;
    lVar50 = 0;
    uVar46 = 0;
    do {
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d1b;
      sprintf((char *)__s,"key%d",uVar46 & 0xffffffff);
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d2f;
      sprintf((char *)__s_00,"body%d",uVar46 & 0xffffffff);
      lVar5 = lVar50 + -0x1410;
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d3f;
      sVar10 = strlen((char *)__s);
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d4a;
      sVar11 = strlen((char *)__s_00);
      pfVar16[-10].kvs_config.custom_cmp_param = (void *)sVar11;
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d64;
      fdb_doc_create((fdb_doc **)((long)pfVar16 + lVar5),__s,sVar10,(void *)0x0,0,__s_00,
                     (size_t)pfVar16[-10].kvs_config.custom_cmp_param);
      pfVar15 = (fdb_kvs_handle *)pfVar16[-10].fhandle;
      pfVar18 = *(fdb_doc **)((long)pfVar16 + uVar46 * 8 + -0x1410);
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d73;
      fdb_set(pfVar15,pfVar18);
      uVar46 = uVar46 + 1;
      lVar50 = lVar50 + 8;
    } while (uVar46 != 10);
    doc = (list *)0x0;
    do {
      pfVar15 = (fdb_kvs_handle *)pfVar16[-10].fhandle;
      psVar3 = *(size_t **)((long)pfVar16 + (long)doc * 8 + -0x1410);
      keylen = *psVar3;
      pvVar53 = (void *)psVar3[4];
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115d98;
      fVar7 = fdb_del_kv(pfVar15,pvVar53,keylen);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115f06;
        iterator_no_deletes_test();
        goto LAB_00115f06;
      }
      doc = (list *)((long)&doc->head + 1);
    } while (doc != (list *)0xa);
    pbVar2 = pfVar16[-10].staletree;
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115db5;
    fdb_commit((fdb_file_handle *)pbVar2,'\0');
    pfVar15 = (fdb_kvs_handle *)pfVar16[-10].fhandle;
    pfVar18 = (fdb_doc *)pfVar16[-10].dhandle;
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115dc4;
    fVar7 = fdb_set(pfVar15,pfVar18);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      keylen_00 = (pfVar16[-10].dhandle)->file;
      pvVar53 = (void *)(pfVar16[-10].dhandle)->lastBmpRevnum;
      pfVar16[-10].kvs_config.custom_cmp_param = (void *)0x0;
      doc = (list *)&pfVar16[-10].op_stats;
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115df5;
      fdb_doc_create((fdb_doc **)doc,pvVar53,(size_t)keylen_00,(void *)0x0,0,(void *)0x0,
                     (size_t)pfVar16[-10].kvs_config.custom_cmp_param);
      pfVar15 = (fdb_kvs_handle *)pfVar16[-10].fhandle;
      pfVar18 = *(fdb_doc **)doc;
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e02;
      fVar7 = fdb_get(pfVar15,pfVar18);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115f0b;
      doc_00 = (hbtrie *)pfVar16[-10].op_stats;
      if (*(char *)&doc_00->map != '\0') {
        doc = (list *)&pfVar16[-10].trie;
        pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e27;
        iterator_no_deletes_test();
        doc_00 = *(hbtrie **)doc;
      }
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e2f;
      fdb_doc_free((fdb_doc *)doc_00);
      pfVar16[-10].op_stats = (kvs_ops_stat *)0x0;
      pfVar15 = (fdb_kvs_handle *)pfVar16[-10].fhandle;
      *(undefined4 *)&pfVar16[-10].kvs_config.custom_cmp_param = 2;
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e58;
      fVar7 = fdb_iterator_init(pfVar15,(fdb_iterator **)&pfVar16[-10].trie,(void *)0x0,0,
                                (void *)0x0,0,
                                *(fdb_iterator_opt_t *)&pfVar16[-10].kvs_config.custom_cmp_param);
      if (fVar7 == FDB_RESULT_SUCCESS) {
        pfVar9 = (fdb_iterator *)pfVar16[-10].trie;
        pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e6f;
        fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-10].op_stats);
        if (fVar7 == FDB_RESULT_SUCCESS) {
          pfVar18 = (fdb_doc *)pfVar16[-10].op_stats;
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e81;
          fdb_doc_free(pfVar18);
          pfVar9 = (fdb_iterator *)pfVar16[-10].trie;
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e8b;
          fdb_iterator_close(pfVar9);
          lVar50 = 0;
          do {
            pfVar18 = *(fdb_doc **)((long)pfVar16 + lVar50 * 8 + -0x1410);
            pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115e97;
            fdb_doc_free(pfVar18);
            lVar50 = lVar50 + 1;
          } while (lVar50 != 10);
          pfVar15 = (fdb_kvs_handle *)pfVar16[-10].fhandle;
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115eaa;
          fdb_kvs_close(pfVar15);
          pbVar2 = pfVar16[-10].staletree;
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115eb4;
          fdb_close((fdb_file_handle *)pbVar2);
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115eb9;
          fdb_shutdown();
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115ebe;
          memleak_end();
          pcVar47 = "%s PASSED\n";
          if (iterator_no_deletes_test()::__test_pass != '\0') {
            pcVar47 = "%s FAILED\n";
          }
          pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115eef;
          fprintf(_stderr,pcVar47,"iterator no deletes test");
          return;
        }
        goto LAB_00115f15;
      }
    }
    else {
LAB_00115f06:
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115f0b;
      iterator_no_deletes_test();
LAB_00115f0b:
      pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115f10;
      iterator_no_deletes_test();
    }
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)0x115f15;
    iterator_no_deletes_test();
LAB_00115f15:
    pfVar16[-10].kvs_config.custom_cmp = iterator_set_del_docs_test;
    iterator_no_deletes_test();
    pfVar16[-10].kvs_config.custom_cmp = (fdb_custom_cmp_variable)((long)pfVar16 + lVar5);
    *(long *)&pfVar16[-10].kvs_config = lVar50;
    pfVar16[-0xb].bub_ctx.handle = (fdb_kvs_handle *)__s;
    pfVar16[-0xb].bub_ctx.space_used = 10;
    pfVar16[-0xb].bub_ctx.num_entries = (uint64_t)__s_00;
    pfVar16[-0xb].bub_ctx.entries = doc;
    pfVar16[-0xe].trie = (hbtrie *)0x115f37;
    gettimeofday((timeval *)&pfVar16[-0xe].config.multi_kv_instances,(__timezone_ptr_t)0x0);
    pfVar16[-0xe].trie = (hbtrie *)0x115f3c;
    memleak_start();
    pfVar16[-0xe].trie = (hbtrie *)0x115f4c;
    fdb_get_default_config();
    pfVar16[-0xe].trie = (hbtrie *)0x115f5c;
    fdb_get_default_kvs_config();
    pfVar16[-0xe].trie = (hbtrie *)0x115f68;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar16[-0xc].config.encryption_key.algorithm = 0x400;
    pfVar16[-0xc].config.encryption_key.bytes[0] = '\0';
    pfVar16[-0xc].config.encryption_key.bytes[1] = '\0';
    pfVar16[-0xc].config.encryption_key.bytes[2] = '\0';
    pfVar16[-0xc].config.encryption_key.bytes[3] = '\0';
    pfVar4 = &pfVar16[-0xc].config;
    (pfVar4->encryption_key).bytes[0x10] = '\x01';
    (pfVar4->encryption_key).bytes[0x11] = '\0';
    (pfVar4->encryption_key).bytes[0x12] = '\0';
    (pfVar4->encryption_key).bytes[0x13] = '\0';
    pfVar16[-0xc].config.encryption_key.bytes[0x1b] = '\n';
    pfVar4 = &pfVar16[-0xc].config;
    (pfVar4->encryption_key).bytes[8] = '\x01';
    (pfVar4->encryption_key).bytes[9] = '\0';
    (pfVar4->encryption_key).bytes[10] = '\0';
    (pfVar4->encryption_key).bytes[0xb] = '\0';
    pfVar16[-0xe].trie = (hbtrie *)0x115f96;
    fdb_open((fdb_file_handle **)&pfVar16[-0xe].fileops,"./iterator_test1",
             (fdb_config *)&pfVar16[-0xc].config.enable_background_compactor);
    pfVar16[-0xe].trie = (hbtrie *)0x115fad;
    fdb_kvs_open((fdb_file_handle *)pfVar16[-0xe].fileops,(fdb_kvs_handle **)&pfVar16[-0xe].file,
                 "kv1",(fdb_kvs_config *)&pfVar16[-0xe].config.num_wal_partitions);
    psVar3 = &pfVar16[-0xb].config.max_writer_lock_prob;
    pfVar16[-0xe].bhandle = (btreeblk_handle *)0x0;
    iVar8 = 0;
    do {
      *(int *)((long)&pfVar16[-0xe].dhandle + 4) = iVar8;
      lVar50 = 0;
      uVar46 = 0;
      do {
        uVar13 = *(uint *)((long)&pfVar16[-0xe].dhandle + 4);
        pfVar16[-0xe].trie = (hbtrie *)0x115fed;
        sprintf((char *)psVar3,"key%02d%03d",(ulong)uVar13,uVar46 & 0xffffffff);
        __s_01 = &pfVar16[-0xc].bub_ctx;
        pfVar16[-0xe].trie = (hbtrie *)0x11600c;
        sprintf((char *)__s_01,"meta%02d%03d",(ulong)uVar13,uVar46 & 0xffffffff);
        pfVar16[-0xe].trie = (hbtrie *)0x116023;
        sprintf((char *)&pfVar16[-0xe].config.compaction_cb_ctx,"body%02d%03d",(ulong)uVar13,
                uVar46 & 0xffffffff);
        *(undefined1 **)&pfVar16[-0xe].config = (undefined1 *)((long)pfVar16 + lVar50 + -0x1a98);
        pfVar16[-0xe].trie = (hbtrie *)0x11603a;
        sVar10 = strlen((char *)psVar3);
        pfVar16[-0xe].trie = (hbtrie *)0x116045;
        sVar11 = strlen((char *)__s_01);
        pfVar16[-0xe].trie = (hbtrie *)0x116055;
        sVar12 = strlen((char *)&pfVar16[-0xe].config.compaction_cb_ctx);
        pfVar16[-0xe].staletree = (btree *)sVar12;
        pfVar16[-0xe].trie = (hbtrie *)0x11607a;
        fdb_doc_create(*(fdb_doc ***)&pfVar16[-0xe].config,psVar3,sVar10,__s_01,sVar11,
                       &pfVar16[-0xe].config.compaction_cb_ctx,(size_t)pfVar16[-0xe].staletree);
        pfVar18 = *(fdb_doc **)((long)pfVar16 + uVar46 * 8 + -0x1a98);
        pfVar16[-0xe].trie = (hbtrie *)0x11608c;
        fdb_set((fdb_kvs_handle *)pfVar16[-0xe].file,pfVar18);
        uVar46 = uVar46 + 1;
        lVar50 = lVar50 + 8;
      } while (uVar46 != 100);
      pfVar16[-0xe].trie = (hbtrie *)0x1160ac;
      fdb_commit((fdb_file_handle *)pfVar16[-0xe].fileops,'\x01');
      lVar50 = 0;
      do {
        pfVar18 = *(fdb_doc **)((long)pfVar16 + lVar50 * 8 + -0x19d0);
        pfVar16[-0xe].trie = (hbtrie *)0x1160c0;
        fdb_del((fdb_kvs_handle *)pfVar16[-0xe].file,pfVar18);
        lVar50 = lVar50 + 1;
      } while (lVar50 != 0x19);
      pbVar19 = (btreeblk_handle *)((long)&((pfVar16[-0xe].bhandle)->blockpool).head + 3);
      pfVar16[-0xe].trie = (hbtrie *)0x1160e1;
      fdb_commit((fdb_file_handle *)pfVar16[-0xe].fileops,'\x01');
      pfVar16[-0xe].trie = (hbtrie *)0x1160f0;
      fdb_get_kvs_info((fdb_kvs_handle *)pfVar16[-0xe].file,
                       (fdb_kvs_info *)&pfVar16[-0xe].config.wal_threshold);
      pfVar16[-0xe].bhandle = pbVar19;
      if (*(btreeblk_handle **)&pfVar16[-0xe].config.seqtree_opt != pbVar19) {
        *(undefined4 *)&pfVar16[-0xe].staletree = 0;
        uVar46 = 0;
        pfVar16[-0xe].trie = (hbtrie *)0x116123;
        fdb_iterator_init((fdb_kvs_handle *)pfVar16[-0xe].file,
                          (fdb_iterator **)&pfVar16[-0xe].btreeblkops,(void *)0x0,0,(void *)0x0,0,
                          *(fdb_iterator_opt_t *)&pfVar16[-0xe].staletree);
        do {
          pfVar16[-0xe].trie = (hbtrie *)0x116135;
          fdb_iterator_get((fdb_iterator *)pfVar16[-0xe].btreeblkops,
                           (fdb_doc **)&pfVar16[-0xe].config.buffercache_size);
          pfVar18 = (fdb_doc *)pfVar16[-0xe].config.buffercache_size;
          uVar46 = (ulong)((int)uVar46 + (pfVar18->deleted ^ 1));
          pfVar16[-0xe].trie = (hbtrie *)0x116149;
          fdb_doc_free(pfVar18);
          pfVar16[-0xe].trie = (hbtrie *)0x116153;
          fVar7 = fdb_iterator_next((fdb_iterator *)pfVar16[-0xe].btreeblkops);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        pfVar16[-0xe].trie = (hbtrie *)0x116162;
        fdb_iterator_close((fdb_iterator *)pfVar16[-0xe].btreeblkops);
        pbVar19 = pfVar16[-0xe].bhandle;
        pfVar16[-0xe].trie = (hbtrie *)0x11617a;
        printf("dbdocs(%d) expected(%d)\n",uVar46,(ulong)pbVar19 & 0xffffffff);
        if (*(btreeblk_handle **)&pfVar16[-0xe].config.seqtree_opt != pbVar19) {
          pfVar16[-0xe].trie = (hbtrie *)0x1161b9;
          iterator_set_del_docs_test();
        }
      }
      lVar50 = 0;
      do {
        pfVar18 = *(fdb_doc **)((long)pfVar16 + lVar50 * 8 + -0x1a98);
        pfVar16[-0xe].trie = (hbtrie *)0x116190;
        fdb_doc_free(pfVar18);
        lVar50 = lVar50 + 1;
      } while (lVar50 != 100);
      iVar8 = *(int *)((long)&pfVar16[-0xe].dhandle + 4) + 1;
    } while (iVar8 != 0x14);
    pfVar16[-0xe].trie = (hbtrie *)0x1161c5;
    fdb_kvs_close((fdb_kvs_handle *)pfVar16[-0xe].file);
    pfVar16[-0xe].trie = (hbtrie *)0x1161cf;
    fdb_close((fdb_file_handle *)pfVar16[-0xe].fileops);
    pfVar16[-0xe].trie = (hbtrie *)0x1161d4;
    fdb_shutdown();
    pfVar16[-0xe].trie = (hbtrie *)0x1161d9;
    memleak_end();
    pcVar47 = "%s PASSED\n";
    if (iterator_set_del_docs_test()::__test_pass != '\0') {
      pcVar47 = "%s FAILED\n";
    }
    pfVar16[-0xe].trie = (hbtrie *)0x11620a;
    fprintf(_stderr,pcVar47,"iterator set del docs");
    return;
  }
  pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x113444;
  fVar7 = fdb_kvs_open(pfVar1,(fdb_kvs_handle **)&pfVar16[-3].max_seqnum,"prev KVS",
                       (fdb_kvs_config *)&pfVar16[-2].config.num_wal_partitions);
  pcVar45 = (char *)&stack0xfffffffffffffff8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151ab;
  pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11346a;
  fVar7 = fdb_kvs_open(pfVar1,(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key,"cur KVS",
                       (fdb_kvs_config *)&pfVar16[-2].config.num_wal_partitions);
  pcVar45 = (char *)&stack0xfffffffffffffff8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151b0;
  pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x113493;
  fVar7 = fdb_kvs_open(pfVar1,(fdb_kvs_handle **)&pfVar16[-3].seqnum,"next KVS",
                       (fdb_kvs_config *)&pfVar16[-2].config.num_wal_partitions);
  pcVar45 = (char *)&stack0xfffffffffffffff8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151b5;
  pfVar16[-3].shandle = (snap_handle *)pfVar15;
  fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f76657270;
  *(undefined1 *)&pfVar16[-2].config.max_writer_lock_prob = 0;
  pfVar15 = (fdb_kvs_handle *)&pfVar16[-3].filename;
  *(char **)pfVar15 = (char *)0x6c61765f76657270;
  *(undefined4 *)((long)&pfVar16[-3].filename + 7) = 0x65756c;
  pcVar47 = (char *)pfVar16[-3].max_seqnum;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1134e9;
  sVar10 = strlen(fconfig_00);
  pcVar49 = (char *)(sVar10 + 1);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1134f5;
  sVar10 = strlen((char *)pfVar15);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x11350a;
  fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar47,fconfig_00,(size_t)pcVar49,pfVar15,sVar10 + 1);
  pcVar45 = (char *)&stack0xfffffffffffffff8;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151ba;
  unaff_R13 = (char *)0x79656b5f7478656e;
  fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f7478656e;
  *(undefined1 *)&pfVar16[-2].config.max_writer_lock_prob = 0;
  pcVar45 = (char *)0x6c61765f7478656e;
  pfVar15 = (fdb_kvs_handle *)&pfVar16[-3].filename;
  *(char **)pfVar15 = (char *)0x6c61765f7478656e;
  *(undefined4 *)((long)&pfVar16[-3].filename + 7) = 0x65756c;
  pcVar47 = (char *)pfVar16[-3].seqnum;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x113558;
  sVar10 = strlen(fconfig_00);
  pcVar49 = (char *)(sVar10 + 1);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x113564;
  sVar10 = strlen((char *)pfVar15);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x113579;
  fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar47,fconfig_00,(size_t)pcVar49,pfVar15,sVar10 + 1);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151bf;
  fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f7478656e;
  *(undefined2 *)&pfVar16[-2].config.max_writer_lock_prob = 0x32;
  pfVar15 = (fdb_kvs_handle *)&pfVar16[-3].filename;
  *(char **)pfVar15 = (char *)0x6c61765f7478656e;
  *(undefined4 *)&pfVar16[-3].txn = 0x326575;
  pcVar47 = (char *)pfVar16[-3].seqnum;
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1135b5;
  sVar10 = strlen(fconfig_00);
  pcVar49 = (char *)(sVar10 + 1);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1135c1;
  sVar10 = strlen((char *)pfVar15);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1135d6;
  fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar47,fconfig_00,(size_t)pcVar49,pfVar15,sVar10 + 1);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151c4;
  pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1135ed;
  fVar7 = fdb_commit(pfVar1,'\x01');
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151c9;
  if ((int)pfVar16[-3].shandle == 0) {
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d";
    pcVar49 = (char *)&pfVar16[-3].filename;
    unaff_R13 = (char *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x113633;
      sprintf((char *)pfVar15,"key%06d",(ulong)unaff_R13 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x113643;
      sprintf(pcVar49,"value%08d",(ulong)unaff_R13 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x113650;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x11365c;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x113671;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115125;
      *(undefined4 *)((long)pfVar16 + (long)unaff_R13 * 4 + -0x4f8) = 0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    } while ((uint8_t *)unaff_R13 != (uint8_t *)0x1e);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11369a;
    fVar7 = fdb_commit(pfVar1,'\x01');
    pfVar17 = (fdb_kvs_handle *)unaff_R13;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115248;
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_0011370a:
      pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
      pcVar47 = "value%08d(WAL)";
      pcVar49 = (char *)&pfVar16[-3].filename;
      unaff_R13 = (char *)(fdb_kvs_handle *)0x0;
      do {
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113738;
        sprintf((char *)pfVar15,"key%06d",(ulong)unaff_R13 & 0xffffffff);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113748;
        sprintf(pcVar49,"value%08d(WAL)",(ulong)unaff_R13 & 0xffffffff);
        pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113755;
        sVar10 = strlen((char *)pfVar15);
        fconfig_00 = (char *)(sVar10 + 1);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113761;
        sVar10 = strlen(pcVar49);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113776;
        fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011512a;
        *(undefined4 *)((long)pfVar16 + (long)unaff_R13 * 4 + -0x4f8) = 1;
        pfVar17 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x2;
        bVar54 = unaff_R13 < (fdb_kvs_handle *)0x1c;
        unaff_R13 = (char *)pfVar17;
      } while (bVar54);
      pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1137a0;
      fVar7 = fdb_commit(pfVar1,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) {
LAB_001137a8:
        pfVar14 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
        *(uint *)&pfVar16[-3].config.max_writer_lock_prob =
             (uint)(*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) != 0) * 2;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1137d0;
        fVar7 = fdb_iterator_init(pfVar14,(fdb_iterator **)
                                          &pfVar16[-3].config.enable_background_compactor,
                                  (void *)0x0,0,(void *)0x0,0,
                                  (fdb_iterator_opt_t)pfVar16[-3].config.max_writer_lock_prob);
        unaff_R13 = (char *)pfVar17;
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151ce;
        pfVar15 = (fdb_kvs_handle *)&pfVar16[-3].config.num_bgflusher_threads;
        pcVar45 = "value%08d";
        pcVar47 = (char *)&pfVar16[-3].filename;
        fconfig_00 = (char *)0x0;
        do {
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1137fb;
          fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)pfVar15);
          if (fVar7 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            uVar13 = (int)fconfig_00 +
                     (uint)(*(int *)((long)pfVar16 + (long)(int)fconfig_00 * 4 + -0x4f8) == 2);
            fconfig_00 = (char *)(ulong)uVar13;
            pcVar49 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar49 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113833;
            sprintf(pcVar47,pcVar49,(ulong)uVar13);
            pcVar49 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            sVar10 = ((fdb_doc *)pcVar49)->bodylen;
            unaff_R13 = (char *)((fdb_doc *)pcVar49)->body;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x11384d;
            iVar8 = bcmp(unaff_R13,pcVar47,sVar10);
            if (iVar8 != 0) goto LAB_0011514f;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x11385d;
            fdb_doc_free((fdb_doc *)pcVar49);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            fconfig_00 = (char *)(ulong)(uVar13 + 1);
          }
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113872;
          fVar7 = fdb_iterator_next(pfVar9);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != 0x1e) goto LAB_001151d3;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x11388e;
        fVar7 = fdb_iterator_prev(pfVar9);
        if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001151a1:
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1151a6;
          iterator_complete_test();
          goto LAB_001151a6;
        }
        fconfig_00 = (char *)0x1e;
        pfVar15 = (fdb_kvs_handle *)&pfVar16[-3].config.num_bgflusher_threads;
        pcVar45 = "value%08d";
        pcVar47 = (char *)&pfVar16[-3].filename;
        do {
          uVar13 = (int)fconfig_00 - 1;
          fconfig_00 = (char *)(ulong)uVar13;
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1138bf;
          fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)pfVar15);
          if (fVar7 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            uVar13 = uVar13 - (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) == 2);
            fconfig_00 = (char *)(ulong)uVar13;
            pcVar49 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar49 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1138f7;
            sprintf(pcVar47,pcVar49,(ulong)uVar13);
            pcVar49 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            sVar10 = ((fdb_doc *)pcVar49)->bodylen;
            unaff_R13 = (char *)((fdb_doc *)pcVar49)->body;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113911;
            iVar8 = bcmp(unaff_R13,pcVar47,sVar10);
            if (iVar8 != 0) goto LAB_0011515f;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113921;
            fdb_doc_free((fdb_doc *)pcVar49);
            pfVar16[-3].config.num_bgflusher_threads = 0;
          }
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113934;
          fVar7 = fdb_iterator_prev(pfVar9);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != 0) goto LAB_001151a1;
        pcVar47 = "key%06d";
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        fconfig_00 = (char *)&pfVar16[-3].filename;
        pcVar45 = (char *)0x0;
        do {
          if ((fdb_kvs_handle *)pcVar45 == (fdb_kvs_handle *)0x1e) goto LAB_00113a60;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113977;
          sprintf(pcVar49,"key%06d",(ulong)pcVar45 & 0xffffffff);
          pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113984;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113995;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pcVar49,sVar10 + 1,'\0');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
          puVar6 = &(((fdb_kvs_handle *)pcVar45)->kvs_config).field_0x1;
          iVar8 = *(int *)((long)pfVar16 + (long)pcVar45 * 4 + -0x4f8);
          *(undefined1 **)(pfVar16[-3].config.encryption_key.bytes + 0x14) = puVar6;
          uVar46 = (ulong)pcVar45 & 0xffffffff;
          if (iVar8 == 2) {
            uVar46 = (ulong)puVar6 & 0xffffffff;
          }
          do {
            uVar13 = (uint)uVar46;
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1139bd;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1139d4;
            sprintf(pcVar49,"key%06d",uVar46);
            uVar13 = uVar13 + (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) == 2);
            pcVar45 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar45 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a07;
            sprintf(fconfig_00,pcVar45,(ulong)uVar13);
            pfVar15 = (fdb_kvs_handle *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (pfVar15->kvs_config).custom_cmp_param;
            unaff_R13 = (char *)(pfVar15->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a1f;
            iVar8 = bcmp(unaff_R13,fconfig_00,(size_t)pvVar53);
            if (iVar8 != 0) {
              pfVar16[-3].config.compaction_cb_ctx = (void *)0x115083;
              iterator_complete_test();
              goto LAB_00115083;
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a2f;
            fdb_doc_free((fdb_doc *)pfVar15);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            uVar13 = uVar13 + 1;
            uVar46 = (ulong)uVar13;
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a44;
            fVar7 = fdb_iterator_next(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          pcVar45 = *(char **)(pfVar16[-3].config.encryption_key.bytes + 0x14);
        } while (uVar13 == 0x1e);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a60;
        iterator_complete_test();
LAB_00113a60:
        pcVar47 = "key%06d";
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        fconfig_00 = (char *)&pfVar16[-3].filename;
        pcVar45 = (char *)0x0;
        do {
          if ((fdb_kvs_handle *)pcVar45 == (fdb_kvs_handle *)0x1e) goto LAB_00113b7b;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a92;
          sprintf(pcVar49,"key%06d",(ulong)pcVar45 & 0xffffffff);
          pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113a9f;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ab0;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pcVar49,sVar10 + 1,'\0');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001150f8;
          puVar6 = &(((fdb_kvs_handle *)pcVar45)->kvs_config).field_0x1;
          iVar8 = *(int *)((long)pfVar16 + (long)pcVar45 * 4 + -0x4f8);
          *(undefined1 **)(pfVar16[-3].config.encryption_key.bytes + 0x14) = puVar6;
          uVar46 = (ulong)pcVar45 & 0xffffffff;
          if (iVar8 == 2) {
            uVar46 = (ulong)puVar6 & 0xffffffff;
          }
          do {
            uVar13 = (uint)uVar46;
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ad8;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113aef;
            sprintf(pcVar49,"key%06d",uVar46);
            uVar13 = uVar13 - (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) == 2);
            pcVar45 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar45 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113b22;
            sprintf(fconfig_00,pcVar45,(ulong)uVar13);
            pfVar15 = (fdb_kvs_handle *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (pfVar15->kvs_config).custom_cmp_param;
            unaff_R13 = (char *)(pfVar15->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113b3a;
            iVar8 = bcmp(unaff_R13,fconfig_00,(size_t)pvVar53);
            if (iVar8 != 0) goto LAB_00115083;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113b4a;
            fdb_doc_free((fdb_doc *)pfVar15);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            uVar13 = uVar13 - 1;
            uVar46 = (ulong)uVar13;
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113b5f;
            fVar7 = fdb_iterator_prev(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          pcVar45 = *(char **)(pfVar16[-3].config.encryption_key.bytes + 0x14);
        } while (uVar13 == 0xffffffff);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113b7b;
        iterator_complete_test();
LAB_00113b7b:
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pcVar45 = (char *)&pfVar16[-3].filename;
        fconfig_00 = (char *)0x0;
        do {
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ba0;
          sprintf(pcVar49,"key%06d",(ulong)fconfig_00 & 0xffffffff);
          pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113bad;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113bc1;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pcVar49,sVar10 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
          pfVar15 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)((long)pfVar16 + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113be8;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113c04;
            sprintf(pcVar49,"key%06d",pfVar15);
            uVar13 = (int)pfVar15 +
                     (uint)(*(int *)((long)pfVar16 + (long)(int)pfVar15 * 4 + -0x4f8) == 2);
            pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
            pcVar47 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar47 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113c3a;
            sprintf(pcVar45,pcVar47,(ulong)uVar13);
            unaff_R13 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param;
            pcVar47 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113c52;
            iVar8 = bcmp(pcVar47,pcVar45,(size_t)pvVar53);
            if (iVar8 != 0) goto LAB_00115093;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113c62;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            pfVar15 = (fdb_kvs_handle *)(ulong)(uVar13 + 1);
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113c78;
            fVar7 = fdb_iterator_next(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar15 != 0x1e) goto LAB_00115102;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pcVar45 = (char *)&pfVar16[-3].filename;
        fconfig_00 = (char *)0x0;
        do {
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113cbd;
          sprintf(pcVar49,"key%06d",(ulong)fconfig_00 & 0xffffffff);
          pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113cca;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113cde;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pcVar49,sVar10 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115107;
          pfVar15 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)((long)pfVar16 + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113d05;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113d21;
            sprintf(pcVar49,"key%06d",pfVar15);
            uVar13 = (int)pfVar15 -
                     (uint)(*(int *)((long)pfVar16 + (long)(int)pfVar15 * 4 + -0x4f8) == 2);
            pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
            pcVar47 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar47 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113d57;
            sprintf(pcVar45,pcVar47,(ulong)uVar13);
            unaff_R13 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param;
            pcVar47 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113d6f;
            iVar8 = bcmp(pcVar47,pcVar45,(size_t)pvVar53);
            if (iVar8 != 0) goto LAB_001150a3;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113d7f;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            pfVar15 = (fdb_kvs_handle *)(ulong)(uVar13 - 1);
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113d95;
            fVar7 = fdb_iterator_prev(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar15 != -1) goto LAB_0011510c;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        pcVar47 = "key%06d+";
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        unaff_R13 = (char *)&pfVar16[-3].filename;
        uVar46 = 0;
        do {
          if (uVar46 == 0x1e) goto LAB_00113ed3;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113de7;
          sprintf(pcVar49,"key%06d+",uVar46 & 0xffffffff);
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113df4;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113e05;
          fdb_iterator_seek(pfVar9,pcVar49,sVar10 + 1,'\0');
          iVar8 = *(int *)((long)pfVar16 + uVar46 * 4 + -0x4f4);
          *(ulong *)(pfVar16[-3].config.encryption_key.bytes + 0x14) = uVar46 + 1;
          uVar52 = (ulong)((int)uVar46 + 2);
          if (iVar8 != 2) {
            uVar52 = uVar46 + 1 & 0xffffffff;
          }
          do {
            uVar13 = (uint)uVar52;
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113e2a;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113e42;
            sprintf(pcVar49,"key%06d+",uVar52);
            uVar13 = uVar13 + (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) == 2);
            pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
            pcVar45 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar45 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113e78;
            sprintf(unaff_R13,pcVar45,(ulong)uVar13);
            pcVar45 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (((fdb_kvs_handle *)pcVar45)->kvs_config).custom_cmp_param;
            fconfig_00 = (char *)(((fdb_kvs_handle *)pcVar45)->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113e90;
            iVar8 = bcmp(fconfig_00,unaff_R13,(size_t)pvVar53);
            if (iVar8 != 0) goto LAB_001150b3;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ea0;
            fdb_doc_free((fdb_doc *)pcVar45);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            uVar13 = uVar13 + 1;
            uVar52 = (ulong)uVar13;
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113eb6;
            fVar7 = fdb_iterator_next(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          uVar46 = *(ulong *)(pfVar16[-3].config.encryption_key.bytes + 0x14);
        } while (uVar13 == 0x1e);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ed3;
        iterator_complete_test();
LAB_00113ed3:
        fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        unaff_R13 = (char *)&pfVar16[-3].filename;
        pcVar45 = (char *)0x0;
        do {
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ef8;
          sprintf(fconfig_00,"key%06d+",(ulong)pcVar45 & 0xffffffff);
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113f05;
          sVar10 = strlen(fconfig_00);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x113f16;
          fdb_iterator_seek(pfVar9,fconfig_00,sVar10 + 1,'\0');
          puVar6 = &(((fdb_kvs_handle *)pcVar45)->kvs_config).field_0x1;
          iVar8 = *(int *)((long)pfVar16 + (long)pcVar45 * 4 + -0x4f4);
          *(undefined1 **)(pfVar16[-3].config.encryption_key.bytes + 0x14) = puVar6;
          pfVar15 = (fdb_kvs_handle *)(ulong)((int)pcVar45 + 2);
          if (iVar8 != 2) {
            pfVar15 = (fdb_kvs_handle *)((ulong)puVar6 & 0xffffffff);
          }
          do {
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113f3b;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113f57;
            sprintf(fconfig_00,"key%06d+",pfVar15);
            uVar13 = (int)pfVar15 -
                     (uint)(*(int *)((long)pfVar16 + (long)(int)pfVar15 * 4 + -0x4f8) == 2);
            pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
            pcVar47 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar47 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113f8d;
            sprintf(unaff_R13,pcVar47,(ulong)uVar13);
            pcVar49 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            sVar10 = ((fdb_doc *)pcVar49)->bodylen;
            pcVar47 = (char *)((fdb_doc *)pcVar49)->body;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113fa7;
            iVar8 = bcmp(pcVar47,unaff_R13,sVar10);
            if (iVar8 != 0) goto LAB_001150c3;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113fb7;
            fdb_doc_free((fdb_doc *)pcVar49);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            pfVar15 = (fdb_kvs_handle *)(ulong)(uVar13 - 1);
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x113fcd;
            fVar7 = fdb_iterator_prev(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((fdb_kvs_handle *)pcVar45 == (fdb_kvs_handle *)0x1d) goto LAB_00113ff0;
          pcVar45 = *(char **)(pfVar16[-3].config.encryption_key.bytes + 0x14);
        } while ((int)pfVar15 == -1);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x113ff0;
        iterator_complete_test();
LAB_00113ff0:
        if ((int)pfVar15 != 0x1e) goto LAB_001151d8;
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pcVar45 = (char *)&pfVar16[-3].filename;
        fconfig_00 = (char *)0x0;
        do {
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11401f;
          sprintf(pcVar49,"key%06d+",(ulong)fconfig_00 & 0xffffffff);
          pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11402c;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x114040;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pcVar49,sVar10 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115111;
          pfVar15 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)((long)pfVar16 + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x114067;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x114083;
            sprintf(pcVar49,"key%06d+",pfVar15);
            uVar13 = (int)pfVar15 +
                     (uint)(*(int *)((long)pfVar16 + (long)(int)pfVar15 * 4 + -0x4f8) == 2);
            pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
            pcVar47 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar47 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1140b9;
            sprintf(pcVar45,pcVar47,(ulong)uVar13);
            unaff_R13 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param;
            pcVar47 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1140d1;
            iVar8 = bcmp(pcVar47,pcVar45,(size_t)pvVar53);
            if (iVar8 != 0) goto LAB_001150d3;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1140e1;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            pfVar15 = (fdb_kvs_handle *)(ulong)(uVar13 + 1);
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1140f7;
            fVar7 = fdb_iterator_next(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar15 != 0x1e) goto LAB_00115116;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pcVar45 = (char *)&pfVar16[-3].filename;
        fconfig_00 = (char *)0x0;
        do {
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11413c;
          sprintf(pcVar49,"key%06d+",(ulong)fconfig_00 & 0xffffffff);
          pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x114149;
          sVar10 = strlen(pcVar49);
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11415d;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar15,pcVar49,sVar10 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011511b;
          pfVar15 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)((long)pfVar16 + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x114184;
            fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1141a0;
            sprintf(pcVar49,"key%06d+",pfVar15);
            uVar13 = (int)pfVar15 -
                     (uint)(*(int *)((long)pfVar16 + (long)(int)pfVar15 * 4 + -0x4f8) == 2);
            pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
            pcVar47 = "value%08d";
            if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
              pcVar47 = "value%08d(WAL)";
            }
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1141d6;
            sprintf(pcVar45,pcVar47,(ulong)uVar13);
            unaff_R13 = (char *)pfVar16[-3].config.num_bgflusher_threads;
            pvVar53 = (((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param;
            pcVar47 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1141ee;
            iVar8 = bcmp(pcVar47,pcVar45,(size_t)pvVar53);
            if (iVar8 != 0) goto LAB_001150e3;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x1141fe;
            fdb_doc_free((fdb_doc *)unaff_R13);
            pfVar16[-3].config.num_bgflusher_threads = 0;
            pfVar15 = (fdb_kvs_handle *)(ulong)(uVar13 - 1);
            pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
            pfVar16[-3].config.compaction_cb_ctx = (void *)0x114214;
            fVar7 = fdb_iterator_prev(pfVar9);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar15 != -1) goto LAB_00115120;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x11423e;
        fVar7 = fdb_iterator_seek_to_min(pfVar9);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151dd;
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pcVar47 = "value%08d";
        unaff_R13 = (char *)&pfVar16[-3].filename;
        pfVar15 = (fdb_kvs_handle *)0x0;
        do {
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11426f;
          fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11428b;
          sprintf(pcVar49,"key%06d+",pfVar15);
          uVar13 = (int)pfVar15 +
                   (uint)(*(int *)((long)pfVar16 + (long)(int)pfVar15 * 4 + -0x4f8) == 2);
          pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
          pcVar45 = "value%08d";
          if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
            pcVar45 = "value%08d(WAL)";
          }
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1142bd;
          sprintf(unaff_R13,pcVar45,(ulong)uVar13);
          pcVar45 = (char *)pfVar16[-3].config.num_bgflusher_threads;
          pvVar53 = (((fdb_kvs_handle *)pcVar45)->kvs_config).custom_cmp_param;
          fconfig_00 = (char *)(((fdb_kvs_handle *)pcVar45)->field_6).seqtree;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1142d5;
          iVar8 = bcmp(fconfig_00,unaff_R13,(size_t)pvVar53);
          if (iVar8 != 0) goto LAB_0011512f;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1142e5;
          fdb_doc_free((fdb_doc *)pcVar45);
          pfVar16[-3].config.num_bgflusher_threads = 0;
          pfVar15 = (fdb_kvs_handle *)(ulong)(uVar13 + 1);
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1142fb;
          fVar7 = fdb_iterator_next(pfVar9);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pfVar15 != 0x1e) goto LAB_001151e2;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114318;
        fVar7 = fdb_iterator_seek_to_max(pfVar9);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151e7;
        fconfig_00 = (char *)0x1d;
        pcVar49 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pcVar47 = "value%08d";
        unaff_R13 = (char *)&pfVar16[-3].filename;
        do {
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11434b;
          fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x114366;
          sprintf(pcVar49,"key%06d+",fconfig_00);
          uVar13 = (int)fconfig_00 -
                   (uint)(*(int *)((long)pfVar16 + (long)(int)fconfig_00 * 4 + -0x4f8) == 2);
          fconfig_00 = (char *)(ulong)uVar13;
          pcVar45 = "value%08d";
          if (*(int *)((long)pfVar16 + (long)(int)uVar13 * 4 + -0x4f8) != 0) {
            pcVar45 = "value%08d(WAL)";
          }
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x114395;
          sprintf(unaff_R13,pcVar45,(ulong)uVar13);
          pcVar45 = (char *)pfVar16[-3].config.num_bgflusher_threads;
          pvVar53 = (((fdb_kvs_handle *)pcVar45)->kvs_config).custom_cmp_param;
          pfVar15 = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar45)->field_6).seqtree;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1143ad;
          iVar8 = bcmp(pfVar15,unaff_R13,(size_t)pvVar53);
          if (iVar8 != 0) goto LAB_0011513f;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1143bd;
          fdb_doc_free((fdb_doc *)pcVar45);
          pfVar16[-3].config.num_bgflusher_threads = 0;
          fconfig_00 = (char *)(ulong)(uVar13 - 1);
          pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1143d2;
          fVar7 = fdb_iterator_prev(pfVar9);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != -1) goto LAB_001151ec;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1143ee;
        fVar7 = fdb_iterator_close(pfVar9);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151f1;
        fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114414;
        sprintf(fconfig_00,"key%06d",0x14);
        pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114421;
        sVar10 = strlen(fconfig_00);
        *(undefined4 *)&pfVar16[-3].config.max_writer_lock_prob = 8;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114440;
        fVar7 = fdb_iterator_init(pfVar15,(fdb_iterator **)
                                          &pfVar16[-3].config.enable_background_compactor,
                                  (void *)0x0,0,fconfig_00,sVar10 + 1,
                                  (fdb_iterator_opt_t)pfVar16[-3].config.max_writer_lock_prob);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151f6;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114452;
        fVar7 = fdb_iterator_seek_to_max(pfVar9);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151fb;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114469;
        fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115200;
        unaff_R13 = "value%08d";
        fconfig_00 = "value%08d(WAL)";
        pcVar47 = "value%08d(WAL)";
        if (*(int *)((long)&pfVar16[-3].log_callback.callback + 4) == 0) {
          pcVar47 = "value%08d";
        }
        pcVar49 = (char *)&pfVar16[-3].filename;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1144a5;
        sprintf(pcVar49,pcVar47,0x13);
        pfVar15 = (fdb_kvs_handle *)pfVar16[-3].config.num_bgflusher_threads;
        pvVar53 = (pfVar15->kvs_config).custom_cmp_param;
        pcVar47 = (char *)(pfVar15->field_6).seqtree;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1144bd;
        iVar8 = bcmp(pcVar47,pcVar49,(size_t)pvVar53);
        if (iVar8 != 0) goto LAB_00115205;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1144cd;
        fdb_doc_free((fdb_doc *)pfVar15);
        pfVar16[-3].config.num_bgflusher_threads = 0;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1144e0;
        fVar7 = fdb_iterator_close(pfVar9);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115215;
        pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114506;
        sprintf((char *)pfVar15,"key%06d",10);
        pcVar47 = *(char **)&pfVar16[-3].config.encryption_key;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114513;
        sVar10 = strlen((char *)pfVar15);
        *(undefined4 *)&pfVar16[-3].config.max_writer_lock_prob = 4;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114534;
        fVar7 = fdb_iterator_init((fdb_kvs_handle *)pcVar47,
                                  (fdb_iterator **)&pfVar16[-3].config.enable_background_compactor,
                                  pfVar15,sVar10 + 1,(void *)0x0,0,
                                  (fdb_iterator_opt_t)pfVar16[-3].config.max_writer_lock_prob);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011521a;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114546;
        fVar7 = fdb_iterator_seek_to_min(pfVar9);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011521f;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x11455d;
        fVar7 = fdb_iterator_get(pfVar9,(fdb_doc **)&pfVar16[-3].config.num_bgflusher_threads);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115224;
        if (*(int *)((long)&pfVar16[-3].config.breakpad_minidump_dir + 4) == 0) {
          fconfig_00 = "value%08d";
        }
        pcVar47 = (char *)&pfVar16[-3].filename;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114588;
        sprintf(pcVar47,fconfig_00,0xb);
        fconfig_00 = (char *)pfVar16[-3].config.num_bgflusher_threads;
        __n = (((snap_handle *)fconfig_00)->avl_id).right;
        pfVar15 = (fdb_kvs_handle *)((snap_handle *)fconfig_00)->seqnum;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1145a0;
        iVar8 = bcmp(pfVar15,pcVar47,(size_t)__n);
        if (iVar8 != 0) goto LAB_00115229;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1145b0;
        fdb_doc_free((fdb_doc *)fconfig_00);
        pfVar16[-3].config.num_bgflusher_threads = 0;
        pfVar9 = *(fdb_iterator **)&pfVar16[-3].config.enable_background_compactor;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1145c3;
        fVar7 = fdb_iterator_close(pfVar9);
        fconfig_00 = (char *)pfVar16[-3].shandle;
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115239;
        pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1145dd;
        fVar7 = fdb_close(pfVar1);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011523e;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x1145ea;
        fVar7 = fdb_shutdown();
        if (fVar7 == FDB_RESULT_SUCCESS) {
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x1145f7;
          memleak_end();
          pfVar16[-2].bub_ctx.entries = (list *)0x20747365742065;
          pfVar16[-2].node = (kvs_opened_node *)0x726f746172657469;
          *(undefined8 *)&pfVar16[-2].num_iterators = 0x74656c706d6f6320;
          if ((int)fconfig_00 != 0) goto LAB_00114825;
          pfVar16[-3].config.compaction_cb_ctx = (void *)0x11462d;
          sVar10 = strlen((char *)&pfVar16[-2].node);
          builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x238)),"(HB+trie: all, W",0x10);
          uVar55._0_1_ = ' ';
          uVar55._1_1_ = 'a';
          uVar55._2_1_ = 'l';
          uVar55._3_1_ = 'l';
          uVar57._0_1_ = ',';
          uVar57._1_1_ = ' ';
          uVar57._2_1_ = 'W';
          uVar57._3_1_ = 'A';
          uVar59._0_1_ = 'L';
          uVar59._1_1_ = ':';
          uVar59._2_1_ = ' ';
          uVar59._3_1_ = 'e';
          uVar61._0_1_ = 'v';
          uVar61._1_1_ = 'e';
          uVar61._2_1_ = 'n';
          uVar61._3_1_ = '\0';
          goto LAB_00114643;
        }
        goto LAB_00115243;
      }
      goto LAB_0011524d;
    }
    fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1136c7;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1136d4;
    sVar10 = strlen(fconfig_00);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1136e3;
    fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115252;
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x1136fa;
    fVar7 = fdb_commit(pfVar1,'\x01');
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_0011370a;
    }
    goto LAB_00115257;
  }
  switch((int)pfVar16[-3].shandle) {
  case 1:
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d";
    pcVar49 = (char *)&pfVar16[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1146bf;
      sprintf((char *)pfVar15,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1146cf;
      sprintf(pcVar49,"value%08d",(ulong)pfVar17 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1146dc;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1146e8;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1146fd;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011516f;
      *(undefined4 *)((long)pfVar16 + (long)pfVar17 * 4 + -0x4f8) = 0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
    } while (pfVar17 != (fdb_kvs_handle *)0x1e);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114726;
    fVar7 = fdb_commit(pfVar1,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011525c;
    pcVar47 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar49 = "value%08d(WAL)";
    pfVar17 = (fdb_kvs_handle *)&pfVar16[-3].filename;
    pfVar14 = (fdb_kvs_handle *)0x1;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x11475f;
      sprintf(pcVar47,"key%06d",(ulong)pfVar14 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x11476f;
      sprintf((char *)pfVar17,"value%08d(WAL)",(ulong)pfVar14 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x11477c;
      sVar10 = strlen(pcVar47);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114788;
      sVar10 = strlen((char *)pfVar17);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x11479d;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pcVar47,(size_t)fconfig_00,pfVar17,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011518d;
      *(undefined4 *)((long)pfVar16 + (long)pfVar14 * 4 + -0x4f8) = 1;
      pfVar15 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x2;
      bVar54 = pfVar14 < (fdb_kvs_handle *)0x1c;
      pfVar14 = pfVar15;
    } while (bVar54);
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) != 0) {
      fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1147e0;
      sprintf(fconfig_00,"key%06d",0xf);
      pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1147ed;
      sVar10 = strlen(fconfig_00);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1147fc;
      fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
      if (fVar7 == FDB_RESULT_SUCCESS) {
        *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
        goto LAB_0011480c;
      }
      goto LAB_0011528e;
    }
LAB_0011480c:
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114818;
    fVar7 = fdb_commit(pfVar1,'\0');
    if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114825;
    iterator_complete_test();
    break;
  case 2:
switchD_0011468f_caseD_2:
    pcVar47 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar49 = "value%08d";
    pfVar17 = (fdb_kvs_handle *)&pfVar16[-3].filename;
    pfVar15 = (fdb_kvs_handle *)0x1;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114c90;
      sprintf(pcVar47,"key%06d",(ulong)pfVar15 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ca0;
      sprintf((char *)pfVar17,"value%08d",(ulong)pfVar15 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114cad;
      sVar10 = strlen(pcVar47);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114cb9;
      sVar10 = strlen((char *)pfVar17);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114cce;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pcVar47,(size_t)fconfig_00,pfVar17,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115183;
      *(undefined4 *)((long)pfVar16 + (long)pfVar15 * 4 + -0x4f8) = 0;
      pfVar14 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x2;
      bVar54 = pfVar15 < (fdb_kvs_handle *)0x1c;
      pfVar15 = pfVar14;
    } while (bVar54);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114cfb;
    fVar7 = fdb_commit(pfVar1,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115270;
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114d6b:
      pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
      pcVar47 = "value%08d(WAL)";
      pcVar49 = (char *)&pfVar16[-3].filename;
      unaff_R13 = (char *)(fdb_kvs_handle *)0x0;
      do {
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114d99;
        sprintf((char *)pfVar15,"key%06d",(ulong)unaff_R13 & 0xffffffff);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114da9;
        sprintf(pcVar49,"value%08d(WAL)",(ulong)unaff_R13 & 0xffffffff);
        pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114db6;
        sVar10 = strlen((char *)pfVar15);
        fconfig_00 = (char *)(sVar10 + 1);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114dc2;
        sVar10 = strlen(pcVar49);
        pfVar16[-3].config.compaction_cb_ctx = (void *)0x114dd7;
        fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011519c;
        *(undefined4 *)((long)pfVar16 + (long)unaff_R13 * 4 + -0x4f8) = 1;
        pfVar17 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x2;
        bVar54 = unaff_R13 < (fdb_kvs_handle *)0x1c;
        unaff_R13 = (char *)pfVar17;
      } while (bVar54);
      pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e01;
      fVar7 = fdb_commit(pfVar1,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e0e;
      iterator_complete_test();
      goto switchD_0011468f_default;
    }
    fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114d28;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114d35;
    sVar10 = strlen(fconfig_00);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114d44;
    fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115284;
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114d5b;
    fVar7 = fdb_commit(pfVar1,'\x01');
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114d6b;
    }
    goto LAB_00115289;
  case 3:
switchD_0011468f_caseD_3:
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d";
    pcVar49 = (char *)&pfVar16[-3].filename;
    pfVar14 = (fdb_kvs_handle *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1149eb;
      sprintf((char *)pfVar15,"key%06d",(ulong)pfVar14 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1149fb;
      sprintf(pcVar49,"value%08d",(ulong)pfVar14 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114a08;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114a14;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114a29;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115179;
      *(undefined4 *)((long)pfVar16 + (long)pfVar14 * 4 + -0x4f8) = 0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x2;
      bVar54 = pfVar14 < (fdb_kvs_handle *)0x1c;
      pfVar14 = pfVar17;
    } while (bVar54);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114a56;
    fVar7 = fdb_commit(pfVar1,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115266;
    pcVar47 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar49 = "value%08d(WAL)";
    pfVar17 = (fdb_kvs_handle *)&pfVar16[-3].filename;
    pfVar14 = (fdb_kvs_handle *)0x1;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114a8f;
      sprintf(pcVar47,"key%06d",(ulong)pfVar14 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114a9f;
      sprintf((char *)pfVar17,"value%08d(WAL)",(ulong)pfVar14 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114aac;
      sVar10 = strlen(pcVar47);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ab8;
      sVar10 = strlen((char *)pfVar17);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114acd;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pcVar47,(size_t)fconfig_00,pfVar17,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115192;
      *(undefined4 *)((long)pfVar16 + (long)pfVar14 * 4 + -0x4f8) = 1;
      pfVar15 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x2;
      bVar54 = pfVar14 < (fdb_kvs_handle *)0x1c;
      pfVar14 = pfVar15;
    } while (bVar54);
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114b3c:
      pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b48;
      fVar7 = fdb_commit(pfVar1,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b55;
      iterator_complete_test();
      goto switchD_0011468f_caseD_4;
    }
    fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b10;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b1d;
    sVar10 = strlen(fconfig_00);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b2c;
    fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114b3c;
    }
    goto LAB_00115293;
  case 4:
switchD_0011468f_caseD_4:
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d";
    pcVar49 = (char *)&pfVar16[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b83;
      sprintf((char *)pfVar15,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114b93;
      sprintf(pcVar49,"value%08d",(ulong)pfVar17 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ba0;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114bac;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114bc1;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011517e;
      *(undefined4 *)((long)pfVar16 + (long)pfVar17 * 4 + -0x4f8) = 0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
    } while (pfVar17 != (fdb_kvs_handle *)0x1e);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114bea;
    fVar7 = fdb_commit(pfVar1,'\x01');
    pfVar14 = pfVar15;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011526b;
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114c43:
      pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114c52;
      fVar7 = fdb_commit(pfVar1,'\x01');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114c5f;
      iterator_complete_test();
      goto switchD_0011468f_caseD_2;
    }
    fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114c17;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114c24;
    sVar10 = strlen(fconfig_00);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114c33;
    fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114c43;
    }
    goto LAB_0011527f;
  case 5:
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d";
    pcVar49 = (char *)&pfVar16[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1148e7;
      sprintf((char *)pfVar15,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1148f7;
      sprintf(pcVar49,"value%08d",(ulong)pfVar17 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114904;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114910;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114925;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115174;
      *(undefined4 *)((long)pfVar16 + (long)pfVar17 * 4 + -0x4f8) = 0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
    } while (pfVar17 != (fdb_kvs_handle *)0x1e);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11494b;
    fVar7 = fdb_commit(pfVar1,'\0');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115261;
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_001149a4:
      pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1149b0;
      fVar7 = fdb_commit(pfVar1,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x1149bd;
      iterator_complete_test();
      goto switchD_0011468f_caseD_3;
    }
    fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114978;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114985;
    sVar10 = strlen(fconfig_00);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114994;
    fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_001149a4;
    }
    goto LAB_0011527a;
  default:
switchD_0011468f_default:
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d";
    pcVar49 = (char *)&pfVar16[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e3c;
      sprintf((char *)pfVar15,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e4c;
      sprintf(pcVar49,"value%08d",(ulong)pfVar17 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e59;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e65;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114e7a;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      pfVar14 = pfVar15;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115188;
      *(undefined4 *)((long)pfVar16 + (long)pfVar17 * 4 + -0x4f8) = 0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
    } while (pfVar17 != (fdb_kvs_handle *)0x1e);
    pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ea3;
    fVar7 = fdb_commit(pfVar1,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115275;
    pfVar15 = (fdb_kvs_handle *)&pfVar16[-2].config.compaction_cb_ctx;
    pcVar47 = "value%08d(WAL)";
    pcVar49 = (char *)&pfVar16[-3].filename;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ed9;
      sprintf((char *)pfVar15,"key%06d",(ulong)pfVar17 & 0xffffffff);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ee9;
      sprintf(pcVar49,"value%08d(WAL)",(ulong)pfVar17 & 0xffffffff);
      pcVar45 = *(char **)&pfVar16[-3].config.encryption_key;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ef6;
      sVar10 = strlen((char *)pfVar15);
      fconfig_00 = (char *)(sVar10 + 1);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f02;
      sVar10 = strlen(pcVar49);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f17;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar45,pfVar15,(size_t)fconfig_00,pcVar49,sVar10 + 1);
      unaff_R13 = (char *)pfVar17;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115197;
      *(undefined4 *)((long)pfVar16 + (long)pfVar17 * 4 + -0x4f8) = 1;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
    } while (pfVar17 != (fdb_kvs_handle *)0x1e);
    if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
LAB_00114f82:
      pfVar1 = *(fdb_file_handle **)(pfVar16[-3].config.encryption_key.bytes + 4);
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f8e;
      fVar7 = fdb_commit(pfVar1,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f9b;
      iterator_complete_test();
switchD_0011483e_caseD_5:
      pfVar16[-3].config.compaction_cb_ctx = (void *)0x114fa8;
      sVar10 = strlen((char *)&pfVar16[-2].node);
      builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x238)),"(HB+trie: empty,",0x10);
      uVar56._0_1_ = 'e';
      uVar56._1_1_ = 'm';
      uVar56._2_1_ = 'p';
      uVar56._3_1_ = 't';
      uVar58._0_1_ = 'y';
      uVar58._1_1_ = ',';
      uVar58._2_1_ = ' ';
      uVar58._3_1_ = 'W';
      uVar60._0_1_ = 'A';
      uVar60._1_1_ = 'L';
      uVar60._2_1_ = ':';
      uVar60._3_1_ = ' ';
      uVar62._0_1_ = 'a';
      uVar62._1_1_ = 'l';
      uVar62._2_1_ = 'l';
      uVar62._3_1_ = '\0';
LAB_0011500b:
      pcVar47 = (char *)((long)pfVar16 + (sVar10 - 0x22e));
      *(undefined4 *)pcVar47 = uVar56;
      *(undefined4 *)(pcVar47 + 4) = uVar58;
      *(undefined4 *)(pcVar47 + 8) = uVar60;
      *(undefined4 *)(pcVar47 + 0xc) = uVar62;
      goto switchD_0011483e_default;
    }
    fconfig_00 = (char *)&pfVar16[-2].config.compaction_cb_ctx;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f56;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar15 = *(fdb_kvs_handle **)&pfVar16[-3].config.encryption_key;
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f63;
    sVar10 = strlen(fconfig_00);
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114f72;
    fVar7 = fdb_del_kv(pfVar15,fconfig_00,sVar10 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&pfVar16[-3].config.do_not_cache_doc_blocks = 2;
      goto LAB_00114f82;
    }
    goto LAB_00115298;
  }
LAB_00114825:
  switch((int)fconfig_00) {
  case 1:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11484d;
    sVar10 = strlen((char *)&pfVar16[-2].node);
    *(undefined8 *)((long)pfVar16 + (sVar10 - 0x228)) = 0x64646f203a4c41;
    break;
  case 2:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x115025;
    sVar10 = strlen((char *)&pfVar16[-2].node);
    builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x238)),"(HB+trie: odd, W",0x10);
    uVar55._0_1_ = ' ';
    uVar55._1_1_ = 'o';
    uVar55._2_1_ = 'd';
    uVar55._3_1_ = 'd';
    uVar57._0_1_ = ',';
    uVar57._1_1_ = ' ';
    uVar57._2_1_ = 'W';
    uVar57._3_1_ = 'A';
    uVar59._0_1_ = 'L';
    uVar59._1_1_ = ':';
    uVar59._2_1_ = ' ';
    uVar59._3_1_ = 'e';
    uVar61._0_1_ = 'v';
    uVar61._1_1_ = 'e';
    uVar61._2_1_ = 'n';
    uVar61._3_1_ = '\0';
    goto LAB_00114643;
  case 3:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114fcd;
    sVar10 = strlen((char *)&pfVar16[-2].node);
    builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x238)),"(HB+trie: even, ",0x10);
    uVar55._0_1_ = ' ';
    uVar55._1_1_ = 'e';
    uVar55._2_1_ = 'v';
    uVar55._3_1_ = 'e';
    uVar57._0_1_ = 'n';
    uVar57._1_1_ = ',';
    uVar57._2_1_ = ' ';
    uVar57._3_1_ = 'W';
    uVar59._0_1_ = 'A';
    uVar59._1_1_ = 'L';
    uVar59._2_1_ = ':';
    uVar59._3_1_ = ' ';
    uVar61._0_1_ = 'o';
    uVar61._1_1_ = 'd';
    uVar61._2_1_ = 'd';
    uVar61._3_1_ = '\0';
LAB_00114643:
    pcVar47 = (char *)((long)pfVar16 + (sVar10 - 0x22f));
    *(undefined4 *)pcVar47 = uVar55;
    *(undefined4 *)(pcVar47 + 4) = uVar57;
    *(undefined4 *)(pcVar47 + 8) = uVar59;
    *(undefined4 *)(pcVar47 + 0xc) = uVar61;
    goto switchD_0011483e_default;
  case 4:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x114ff5;
    sVar10 = strlen((char *)&pfVar16[-2].node);
    builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x238)),"(HB+trie: all, W",0x10);
    uVar56._0_1_ = 'a';
    uVar56._1_1_ = 'l';
    uVar56._2_1_ = 'l';
    uVar56._3_1_ = ',';
    uVar58._0_1_ = ' ';
    uVar58._1_1_ = 'W';
    uVar58._2_1_ = 'A';
    uVar58._3_1_ = 'L';
    uVar60._0_1_ = ':';
    uVar60._1_1_ = ' ';
    uVar60._2_1_ = 'e';
    uVar60._3_1_ = 'm';
    uVar62._0_1_ = 'p';
    uVar62._1_1_ = 't';
    uVar62._2_1_ = 'y';
    uVar62._3_1_ = '\0';
    goto LAB_0011500b;
  case 5:
    goto switchD_0011483e_caseD_5;
  case 6:
    pfVar16[-3].config.compaction_cb_ctx = (void *)0x11504d;
    sVar10 = strlen((char *)&pfVar16[-2].node);
    *(undefined8 *)((long)pfVar16 + (sVar10 - 0x228)) = 0x6c6c61203a4c41;
    break;
  default:
    goto switchD_0011483e_default;
  }
  builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x238)),"(HB+trie: all, W",0x10);
switchD_0011483e_default:
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x114658;
  sVar10 = strlen((char *)&pfVar16[-2].node);
  pcVar47 = (char *)((long)pfVar16 + (sVar10 - 0x238));
  if (*(int *)(pfVar16[-3].config.encryption_key.bytes + 0x10) == 0) {
    pcVar47[0] = ')';
    pcVar47[1] = '\0';
  }
  else {
    builtin_strncpy(pcVar47,", do",4);
    builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x234)),"c de",4);
    builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x230)),"leti",4);
    builtin_strncpy((char *)((long)pfVar16 + (sVar10 - 0x22c)),"on)",4);
  }
  pcVar47 = "%s PASSED\n";
  if (iterator_complete_test(int,int)::__test_pass != '\0') {
    pcVar47 = "%s FAILED\n";
  }
  pfVar16[-3].config.compaction_cb_ctx = (void *)0x1148a7;
  fprintf(_stderr,pcVar47,&pfVar16[-2].node);
  return;
}

Assistant:

void iterator_seek_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes before compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert documents of odd number into the main (default) KV store handle
    for (i=1;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents of even number
    for (i=0;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now odd number docs are in hb-trie & even number docs are in WAL

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key in the trie...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek to max using a non-existent FFFF key
    if (status == FDB_RESULT_SUCCESS) {
        uint8_t *big_seek_key = alca(uint8_t, FDB_MAX_KEYLEN);
        memset(big_seek_key, 0xff, FDB_MAX_KEYLEN);
        status = fdb_iterator_seek(iterator, big_seek_key, FDB_MAX_KEYLEN,
                                   FDB_ITR_SEEK_LOWER);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i = n - 1;
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // delete documents of even number so WAL only has deleted docs
    for (i=0;i<n;i+=2){
        status = fdb_del(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek forward to 2nd key ..
    rdoc = NULL;
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek test");
}